

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersectorK<4,16>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  byte bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [60];
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  byte bVar47;
  uint uVar48;
  ulong uVar49;
  uint uVar51;
  long lVar52;
  long lVar53;
  ulong uVar54;
  ulong uVar55;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  bool bVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar115 [64];
  undefined1 auVar117 [64];
  undefined1 auVar119 [64];
  undefined1 auVar121 [64];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  int iVar126;
  undefined4 uVar127;
  vint4 bi_2;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [64];
  vint4 bi_1;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  vint4 bi;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  vfloat4 a0;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  vint4 ai;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  vint4 ai_1;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  float fVar174;
  __m128 a;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar189;
  float fVar196;
  vint4 ai_2;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar197;
  float fVar212;
  float fVar213;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar214;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  vfloat4 a0_3;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  float fVar229;
  float fVar238;
  float fVar239;
  vfloat4 b0_2;
  undefined1 auVar230 [16];
  float fVar240;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar262;
  undefined1 auVar261 [16];
  vfloat4 a0_4;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [64];
  undefined1 auVar277 [64];
  undefined1 auVar278 [64];
  undefined1 auVar279 [64];
  undefined1 auVar280 [64];
  undefined1 auVar281 [64];
  undefined1 auVar282 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  RTCFilterFunctionNArguments local_640;
  uint auStack_610 [4];
  undefined1 local_600 [16];
  undefined1 local_5f0 [8];
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [8];
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined8 uStack_420;
  undefined1 local_400 [64];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar50;
  undefined1 auVar114 [64];
  undefined1 auVar116 [64];
  undefined1 auVar118 [64];
  undefined1 auVar120 [64];
  undefined1 auVar122 [64];
  float fVar152;
  float fVar160;
  float fVar161;
  float fVar173;
  float fVar175;
  float fVar188;
  
  uVar49 = (ulong)(byte)prim[1];
  lVar52 = uVar49 * 0x25;
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 4 + 6)));
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 5 + 6)));
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 6 + 6)));
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0xf + 6)));
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0x11 + 6)));
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0x1a + 6)));
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0x1b + 6)));
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0x1c + 6)));
  uVar127 = *(undefined4 *)(prim + lVar52 + 0x12);
  auVar268._4_4_ = uVar127;
  auVar268._0_4_ = uVar127;
  auVar268._8_4_ = uVar127;
  auVar268._12_4_ = uVar127;
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar60 = vsubps_avx512vl(auVar75,*(undefined1 (*) [16])(prim + lVar52 + 6));
  fVar174 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar52 + 0x16)) *
            *(float *)(prim + lVar52 + 0x1a);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar49 * 7 + 6);
  auVar81 = vpmovsxwd_avx(auVar75);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar49 * 0xb + 6);
  auVar80 = vpmovsxwd_avx(auVar78);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar49 * 9 + 6);
  auVar82 = vpmovsxwd_avx(auVar84);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar49 * 0xd + 6);
  auVar83 = vpmovsxwd_avx(auVar76);
  auVar61 = vpbroadcastd_avx512vl();
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar49 * 0x12 + 6);
  auVar62 = vpmovsxwd_avx512vl(auVar85);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)(prim + uVar49 * 0x16 + 6);
  auVar63 = vpmovsxwd_avx512vl(auVar66);
  auVar276 = ZEXT1664(auVar63);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *(ulong *)(prim + uVar49 * 0x14 + 6);
  auVar64 = vpmovsxwd_avx512vl(auVar65);
  auVar75 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar75 = vinsertps_avx512f(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar65 = vmulps_avx512vl(auVar268,auVar60);
  auVar66 = vmulps_avx512vl(auVar268,auVar75);
  auVar67 = vcvtdq2ps_avx512vl(auVar67);
  auVar68 = vcvtdq2ps_avx512vl(auVar68);
  auVar69 = vcvtdq2ps_avx512vl(auVar69);
  auVar70 = vcvtdq2ps_avx512vl(auVar70);
  auVar71 = vcvtdq2ps_avx512vl(auVar71);
  auVar75 = vcvtdq2ps_avx(auVar72);
  auVar78 = vcvtdq2ps_avx(auVar73);
  auVar84 = vcvtdq2ps_avx(auVar74);
  auVar76 = vcvtdq2ps_avx(auVar77);
  uVar127 = auVar66._0_4_;
  auVar90._4_4_ = uVar127;
  auVar90._0_4_ = uVar127;
  auVar90._8_4_ = uVar127;
  auVar90._12_4_ = uVar127;
  auVar85 = vshufps_avx(auVar66,auVar66,0x55);
  auVar66 = vshufps_avx(auVar66,auVar66,0xaa);
  auVar72 = vmulps_avx512vl(auVar66,auVar69);
  auVar87._0_4_ = auVar66._0_4_ * auVar75._0_4_;
  auVar87._4_4_ = auVar66._4_4_ * auVar75._4_4_;
  auVar87._8_4_ = auVar66._8_4_ * auVar75._8_4_;
  auVar87._12_4_ = auVar66._12_4_ * auVar75._12_4_;
  auVar86._0_4_ = auVar76._0_4_ * auVar66._0_4_;
  auVar86._4_4_ = auVar76._4_4_ * auVar66._4_4_;
  auVar86._8_4_ = auVar76._8_4_ * auVar66._8_4_;
  auVar86._12_4_ = auVar76._12_4_ * auVar66._12_4_;
  auVar66 = vfmadd231ps_avx512vl(auVar72,auVar85,auVar68);
  auVar72 = vfmadd231ps_avx512vl(auVar87,auVar85,auVar71);
  auVar85 = vfmadd231ps_fma(auVar86,auVar84,auVar85);
  auVar66 = vfmadd231ps_avx512vl(auVar66,auVar90,auVar67);
  auVar72 = vfmadd231ps_avx512vl(auVar72,auVar90,auVar70);
  auVar85 = vfmadd231ps_fma(auVar85,auVar78,auVar90);
  auVar73 = vbroadcastss_avx512vl(auVar65);
  auVar74 = vshufps_avx512vl(auVar65,auVar65,0x55);
  auVar65 = vshufps_avx512vl(auVar65,auVar65,0xaa);
  auVar69 = vmulps_avx512vl(auVar65,auVar69);
  auVar75 = vmulps_avx512vl(auVar65,auVar75);
  auVar76 = vmulps_avx512vl(auVar65,auVar76);
  auVar65 = vfmadd231ps_avx512vl(auVar69,auVar74,auVar68);
  auVar68 = vfmadd231ps_avx512vl(auVar75,auVar74,auVar71);
  auVar75 = vfmadd231ps_fma(auVar76,auVar74,auVar84);
  auVar74 = vfmadd231ps_avx512vl(auVar65,auVar73,auVar67);
  auVar77 = vfmadd231ps_avx512vl(auVar68,auVar73,auVar70);
  auVar73 = vfmadd231ps_fma(auVar75,auVar73,auVar78);
  auVar75 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar280 = ZEXT1664(auVar75);
  auVar78 = vandps_avx512vl(auVar66,auVar75);
  auVar244._8_4_ = 0x219392ef;
  auVar244._0_8_ = 0x219392ef219392ef;
  auVar244._12_4_ = 0x219392ef;
  uVar55 = vcmpps_avx512vl(auVar78,auVar244,1);
  bVar58 = (bool)((byte)uVar55 & 1);
  auVar60._0_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar66._0_4_;
  bVar58 = (bool)((byte)(uVar55 >> 1) & 1);
  auVar60._4_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar66._4_4_;
  bVar58 = (bool)((byte)(uVar55 >> 2) & 1);
  auVar60._8_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar66._8_4_;
  bVar58 = (bool)((byte)(uVar55 >> 3) & 1);
  auVar60._12_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar66._12_4_;
  auVar78 = vandps_avx512vl(auVar72,auVar75);
  uVar55 = vcmpps_avx512vl(auVar78,auVar244,1);
  bVar58 = (bool)((byte)uVar55 & 1);
  auVar88._0_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar72._0_4_;
  bVar58 = (bool)((byte)(uVar55 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar72._4_4_;
  bVar58 = (bool)((byte)(uVar55 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar72._8_4_;
  bVar58 = (bool)((byte)(uVar55 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar72._12_4_;
  auVar75 = vandps_avx512vl(auVar85,auVar75);
  uVar55 = vcmpps_avx512vl(auVar75,auVar244,1);
  bVar58 = (bool)((byte)uVar55 & 1);
  auVar79._0_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar85._0_4_;
  bVar58 = (bool)((byte)(uVar55 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar85._4_4_;
  bVar58 = (bool)((byte)(uVar55 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar85._8_4_;
  bVar58 = (bool)((byte)(uVar55 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar85._12_4_;
  auVar78 = vrcp14ps_avx512vl(auVar60);
  auVar245._8_4_ = 0x3f800000;
  auVar245._0_8_ = 0x3f8000003f800000;
  auVar245._12_4_ = 0x3f800000;
  auVar75 = vfnmadd213ps_fma(auVar60,auVar78,auVar245);
  auVar84 = vfmadd132ps_fma(auVar75,auVar78,auVar78);
  auVar78 = vrcp14ps_avx512vl(auVar88);
  auVar75 = vfnmadd213ps_fma(auVar88,auVar78,auVar245);
  auVar76 = vfmadd132ps_fma(auVar75,auVar78,auVar78);
  auVar78 = vrcp14ps_avx512vl(auVar79);
  auVar75 = vfnmadd213ps_fma(auVar79,auVar78,auVar245);
  auVar85 = vfmadd132ps_fma(auVar75,auVar78,auVar78);
  auVar89._4_4_ = fVar174;
  auVar89._0_4_ = fVar174;
  auVar89._8_4_ = fVar174;
  auVar89._12_4_ = fVar174;
  auVar75 = vcvtdq2ps_avx(auVar81);
  auVar78 = vcvtdq2ps_avx(auVar80);
  auVar78 = vsubps_avx(auVar78,auVar75);
  auVar66 = vfmadd213ps_fma(auVar78,auVar89,auVar75);
  auVar75 = vcvtdq2ps_avx(auVar82);
  auVar78 = vcvtdq2ps_avx(auVar83);
  auVar78 = vsubps_avx(auVar78,auVar75);
  auVar65 = vfmadd213ps_fma(auVar78,auVar89,auVar75);
  auVar78 = vcvtdq2ps_avx512vl(auVar62);
  auVar75 = vcvtdq2ps_avx512vl(auVar63);
  auVar75 = vsubps_avx(auVar75,auVar78);
  auVar72 = vfmadd213ps_fma(auVar75,auVar89,auVar78);
  auVar78 = vcvtdq2ps_avx512vl(auVar64);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + uVar49 * 0x18 + 6);
  auVar75 = vpmovsxwd_avx(auVar67);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar78);
  auVar67 = vfmadd213ps_fma(auVar75,auVar89,auVar78);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar49 * 0x1d + 6);
  auVar75 = vpmovsxwd_avx(auVar68);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar49 * 0x21 + 6);
  auVar78 = vpmovsxwd_avx(auVar69);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx(auVar78,auVar75);
  auVar68 = vfmadd213ps_fma(auVar78,auVar89,auVar75);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar49 * 0x1f + 6);
  auVar75 = vpmovsxwd_avx(auVar70);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar49 * 0x23 + 6);
  auVar78 = vpmovsxwd_avx(auVar71);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx(auVar78,auVar75);
  auVar78 = vfmadd213ps_fma(auVar78,auVar89,auVar75);
  auVar75 = vsubps_avx512vl(auVar66,auVar74);
  auVar83._0_4_ = auVar84._0_4_ * auVar75._0_4_;
  auVar83._4_4_ = auVar84._4_4_ * auVar75._4_4_;
  auVar83._8_4_ = auVar84._8_4_ * auVar75._8_4_;
  auVar83._12_4_ = auVar84._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx512vl(auVar65,auVar74);
  auVar82._0_4_ = auVar84._0_4_ * auVar75._0_4_;
  auVar82._4_4_ = auVar84._4_4_ * auVar75._4_4_;
  auVar82._8_4_ = auVar84._8_4_ * auVar75._8_4_;
  auVar82._12_4_ = auVar84._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar72,auVar77);
  auVar63._0_4_ = auVar76._0_4_ * auVar75._0_4_;
  auVar63._4_4_ = auVar76._4_4_ * auVar75._4_4_;
  auVar63._8_4_ = auVar76._8_4_ * auVar75._8_4_;
  auVar63._12_4_ = auVar76._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar67,auVar77);
  auVar80._0_4_ = auVar76._0_4_ * auVar75._0_4_;
  auVar80._4_4_ = auVar76._4_4_ * auVar75._4_4_;
  auVar80._8_4_ = auVar76._8_4_ * auVar75._8_4_;
  auVar80._12_4_ = auVar76._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar68,auVar73);
  auVar64._0_4_ = auVar85._0_4_ * auVar75._0_4_;
  auVar64._4_4_ = auVar85._4_4_ * auVar75._4_4_;
  auVar64._8_4_ = auVar85._8_4_ * auVar75._8_4_;
  auVar64._12_4_ = auVar85._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar78,auVar73);
  auVar81._0_4_ = auVar85._0_4_ * auVar75._0_4_;
  auVar81._4_4_ = auVar85._4_4_ * auVar75._4_4_;
  auVar81._8_4_ = auVar85._8_4_ * auVar75._8_4_;
  auVar81._12_4_ = auVar85._12_4_ * auVar75._12_4_;
  auVar75 = vpminsd_avx(auVar83,auVar82);
  auVar78 = vpminsd_avx(auVar63,auVar80);
  auVar75 = vmaxps_avx(auVar75,auVar78);
  auVar78 = vpminsd_avx(auVar64,auVar81);
  uVar127 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar72._4_4_ = uVar127;
  auVar72._0_4_ = uVar127;
  auVar72._8_4_ = uVar127;
  auVar72._12_4_ = uVar127;
  auVar78 = vmaxps_avx512vl(auVar78,auVar72);
  auVar75 = vmaxps_avx(auVar75,auVar78);
  auVar73._8_4_ = 0x3f7ffffa;
  auVar73._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar73._12_4_ = 0x3f7ffffa;
  local_600 = vmulps_avx512vl(auVar75,auVar73);
  auVar75 = vpmaxsd_avx(auVar83,auVar82);
  auVar78 = vpmaxsd_avx(auVar63,auVar80);
  auVar75 = vminps_avx(auVar75,auVar78);
  auVar78 = vpmaxsd_avx(auVar64,auVar81);
  uVar127 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar74._4_4_ = uVar127;
  auVar74._0_4_ = uVar127;
  auVar74._8_4_ = uVar127;
  auVar74._12_4_ = uVar127;
  auVar78 = vminps_avx512vl(auVar78,auVar74);
  auVar75 = vminps_avx(auVar75,auVar78);
  auVar77._8_4_ = 0x3f800003;
  auVar77._0_8_ = 0x3f8000033f800003;
  auVar77._12_4_ = 0x3f800003;
  auVar75 = vmulps_avx512vl(auVar75,auVar77);
  uVar26 = vcmpps_avx512vl(local_600,auVar75,2);
  uVar27 = vpcmpgtd_avx512vl(auVar61,_DAT_01f4ad30);
  uVar55 = CONCAT44((int)((ulong)prim >> 0x20),(uint)((byte)uVar26 & 0xf & (byte)uVar27));
  auVar134 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar134);
  auVar75 = vpxord_avx512vl(auVar62,auVar62);
  auVar134 = ZEXT1664(auVar75);
  auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar279 = ZEXT1664(auVar75);
LAB_018c4f2b:
  if (uVar55 == 0) {
    return;
  }
  lVar52 = 0;
  for (uVar49 = uVar55; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
    lVar52 = lVar52 + 1;
  }
  uVar6 = *(uint *)(prim + 2);
  pGVar9 = (context->scene->geometries).items[uVar6].ptr;
  fVar174 = (pGVar9->time_range).lower;
  fVar174 = pGVar9->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x1c0) - fVar174) / ((pGVar9->time_range).upper - fVar174));
  auVar75 = vroundss_avx(ZEXT416((uint)fVar174),ZEXT416((uint)fVar174),9);
  uVar7 = *(uint *)(prim + lVar52 * 4 + 6);
  auVar78 = vaddss_avx512f(ZEXT416((uint)pGVar9->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar75 = vminss_avx(auVar75,auVar78);
  auVar77 = vmaxss_avx512f(auVar134._0_16_,auVar75);
  uVar49 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           (ulong)uVar7 *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar53 = (long)(int)auVar77._0_4_ * 0x38;
  lVar11 = *(long *)(_Var10 + lVar53);
  lVar12 = *(long *)(_Var10 + 0x10 + lVar53);
  auVar75 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar49);
  lVar52 = uVar49 + 1;
  auVar78 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar52);
  lVar1 = uVar49 + 2;
  auVar84 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  lVar2 = uVar49 + 3;
  auVar76 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  lVar11 = *(long *)&pGVar9[4].fnumTimeSegments;
  lVar12 = *(long *)(lVar11 + lVar53);
  lVar13 = *(long *)(lVar11 + 0x10 + lVar53);
  auVar85 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar49);
  auVar66 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar52);
  auVar65 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
  auVar67 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar2);
  lVar12 = *(long *)(_Var10 + 0x38 + lVar53);
  lVar13 = *(long *)(_Var10 + 0x48 + lVar53);
  auVar68 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar49);
  auVar69 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar52);
  auVar70 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
  auVar71 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar2);
  lVar12 = *(long *)(lVar11 + 0x38 + lVar53);
  lVar11 = *(long *)(lVar11 + 0x48 + lVar53);
  auVar72 = *(undefined1 (*) [16])(lVar12 + uVar49 * lVar11);
  auVar73 = *(undefined1 (*) [16])(lVar12 + lVar52 * lVar11);
  auVar74 = *(undefined1 (*) [16])(lVar12 + lVar1 * lVar11);
  auVar80 = vsubss_avx512f(ZEXT416((uint)fVar174),auVar77);
  auVar128._0_12_ = ZEXT812(0);
  auVar128._12_4_ = 0;
  auVar77 = vmulps_avx512vl(auVar76,auVar128);
  auVar77 = vfmadd231ps_avx512vl(auVar77,auVar84,auVar128);
  auVar81 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar78,auVar77);
  auVar82 = vaddps_avx512vl(auVar75,auVar81);
  auVar88 = auVar279._0_16_;
  auVar77 = vfmadd231ps_avx512vl(auVar77,auVar78,auVar88);
  auVar83 = vfnmadd231ps_avx512vl(auVar77,auVar75,auVar88);
  auVar145._0_4_ = auVar67._0_4_ * 0.0;
  auVar145._4_4_ = auVar67._4_4_ * 0.0;
  auVar145._8_4_ = auVar67._8_4_ * 0.0;
  auVar145._12_4_ = auVar67._12_4_ * 0.0;
  auVar77 = vfmadd231ps_fma(auVar145,auVar65,auVar128);
  auVar81 = vpxord_avx512vl(auVar276._0_16_,auVar276._0_16_);
  auVar81 = vfmadd213ps_avx512vl(auVar81,auVar66,auVar77);
  auVar60 = vaddps_avx512vl(auVar85,auVar81);
  auVar77 = vfmadd231ps_avx512vl(auVar77,auVar66,auVar88);
  auVar61 = vfnmadd231ps_avx512vl(auVar77,auVar85,auVar88);
  auVar77 = vxorps_avx512vl(auVar81,auVar81);
  auVar77 = vfmadd213ps_avx512vl(auVar77,auVar84,auVar76);
  auVar77 = vfmadd231ps_avx512vl(auVar77,auVar78,auVar128);
  auVar62 = vfmadd231ps_avx512vl(auVar77,auVar75,auVar128);
  auVar76 = vmulps_avx512vl(auVar76,auVar88);
  auVar84 = vfnmadd231ps_avx512vl(auVar76,auVar88,auVar84);
  auVar78 = vfmadd231ps_fma(auVar84,auVar128,auVar78);
  auVar81 = vfnmadd231ps_fma(auVar78,auVar128,auVar75);
  auVar75 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar65,auVar67);
  auVar75 = vfmadd231ps_fma(auVar75,auVar66,auVar128);
  auVar77 = vfmadd231ps_fma(auVar75,auVar85,auVar128);
  auVar75 = vmulps_avx512vl(auVar67,auVar88);
  auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar88,auVar65);
  auVar75 = vfmadd231ps_fma(auVar75,auVar128,auVar66);
  auVar66 = vfnmadd231ps_fma(auVar75,auVar128,auVar85);
  auVar78 = vshufps_avx512vl(auVar83,auVar83,0xc9);
  auVar75 = vshufps_avx512vl(auVar60,auVar60,0xc9);
  auVar75 = vmulps_avx512vl(auVar83,auVar75);
  auVar75 = vfmsub231ps_avx512vl(auVar75,auVar78,auVar60);
  auVar84 = vshufps_avx(auVar75,auVar75,0xc9);
  auVar75 = vshufps_avx(auVar61,auVar61,0xc9);
  auVar75 = vmulps_avx512vl(auVar83,auVar75);
  auVar75 = vfmsub231ps_fma(auVar75,auVar78,auVar61);
  auVar76 = vshufps_avx(auVar75,auVar75,0xc9);
  auVar75 = vshufps_avx(auVar81,auVar81,0xc9);
  auVar78 = vshufps_avx(auVar77,auVar77,0xc9);
  auVar176._0_4_ = auVar81._0_4_ * auVar78._0_4_;
  auVar176._4_4_ = auVar81._4_4_ * auVar78._4_4_;
  auVar176._8_4_ = auVar81._8_4_ * auVar78._8_4_;
  auVar176._12_4_ = auVar81._12_4_ * auVar78._12_4_;
  auVar78 = vfmsub231ps_fma(auVar176,auVar75,auVar77);
  auVar85 = vshufps_avx(auVar78,auVar78,0xc9);
  auVar78 = vshufps_avx(auVar66,auVar66,0xc9);
  auVar177._0_4_ = auVar81._0_4_ * auVar78._0_4_;
  auVar177._4_4_ = auVar81._4_4_ * auVar78._4_4_;
  auVar177._8_4_ = auVar81._8_4_ * auVar78._8_4_;
  auVar177._12_4_ = auVar81._12_4_ * auVar78._12_4_;
  auVar75 = vfmsub231ps_fma(auVar177,auVar75,auVar66);
  auVar66 = vshufps_avx(auVar75,auVar75,0xc9);
  auVar75 = vdpps_avx(auVar84,auVar84,0x7f);
  auVar78 = vrsqrt14ss_avx512f(auVar128,ZEXT416(auVar75._0_4_));
  auVar65 = vmulss_avx512f(auVar78,ZEXT416(0x3fc00000));
  auVar67 = vmulss_avx512f(auVar75,ZEXT416(0x3f000000));
  auVar67 = vmulss_avx512f(auVar67,auVar78);
  auVar78 = vmulss_avx512f(auVar67,ZEXT416((uint)(auVar78._0_4_ * auVar78._0_4_)));
  fVar229 = auVar65._0_4_ - auVar78._0_4_;
  auVar198._4_4_ = fVar229;
  auVar198._0_4_ = fVar229;
  auVar198._8_4_ = fVar229;
  auVar198._12_4_ = fVar229;
  auVar78 = vdpps_avx(auVar84,auVar76,0x7f);
  auVar65 = vmulps_avx512vl(auVar84,auVar198);
  auVar67 = vbroadcastss_avx512vl(auVar75);
  auVar76 = vmulps_avx512vl(auVar67,auVar76);
  fVar174 = auVar78._0_4_;
  auVar162._0_4_ = fVar174 * auVar84._0_4_;
  auVar162._4_4_ = fVar174 * auVar84._4_4_;
  auVar162._8_4_ = fVar174 * auVar84._8_4_;
  auVar162._12_4_ = fVar174 * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar76,auVar162);
  auVar78 = vrcp14ss_avx512f(auVar128,ZEXT416(auVar75._0_4_));
  auVar75 = vfnmadd213ss_avx512f(auVar75,auVar78,ZEXT416(0x40000000));
  fVar174 = auVar78._0_4_ * auVar75._0_4_;
  auVar75 = vdpps_avx(auVar85,auVar85,0x7f);
  auVar78 = vrsqrt14ss_avx512f(auVar128,ZEXT416(auVar75._0_4_));
  auVar76 = vmulss_avx512f(auVar78,ZEXT416(0x3fc00000));
  auVar67 = vmulss_avx512f(auVar75,ZEXT416(0x3f000000));
  fVar243 = auVar78._0_4_;
  fVar238 = auVar76._0_4_ - auVar67._0_4_ * fVar243 * fVar243 * fVar243;
  auVar199._0_4_ = auVar85._0_4_ * fVar238;
  auVar199._4_4_ = auVar85._4_4_ * fVar238;
  auVar199._8_4_ = auVar85._8_4_ * fVar238;
  auVar199._12_4_ = auVar85._12_4_ * fVar238;
  auVar78 = vdpps_avx(auVar85,auVar66,0x7f);
  auVar76 = vbroadcastss_avx512vl(auVar75);
  auVar76 = vmulps_avx512vl(auVar76,auVar66);
  fVar243 = auVar78._0_4_;
  auVar135._0_4_ = fVar243 * auVar85._0_4_;
  auVar135._4_4_ = fVar243 * auVar85._4_4_;
  auVar135._8_4_ = fVar243 * auVar85._8_4_;
  auVar135._12_4_ = fVar243 * auVar85._12_4_;
  auVar78 = vsubps_avx(auVar76,auVar135);
  auVar76 = vrcp14ss_avx512f(auVar128,ZEXT416(auVar75._0_4_));
  auVar75 = vfnmadd213ss_avx512f(auVar75,auVar76,ZEXT416(0x40000000));
  fVar243 = auVar76._0_4_ * auVar75._0_4_;
  auVar75 = vshufps_avx512vl(auVar82,auVar82,0xff);
  auVar76 = vmulps_avx512vl(auVar75,auVar65);
  auVar67 = vsubps_avx512vl(auVar82,auVar76);
  auVar85 = vshufps_avx512vl(auVar83,auVar83,0xff);
  auVar85 = vmulps_avx512vl(auVar85,auVar65);
  auVar153._0_4_ = auVar85._0_4_ + auVar75._0_4_ * fVar229 * fVar174 * auVar84._0_4_;
  auVar153._4_4_ = auVar85._4_4_ + auVar75._4_4_ * fVar229 * fVar174 * auVar84._4_4_;
  auVar153._8_4_ = auVar85._8_4_ + auVar75._8_4_ * fVar229 * fVar174 * auVar84._8_4_;
  auVar153._12_4_ = auVar85._12_4_ + auVar75._12_4_ * fVar229 * fVar174 * auVar84._12_4_;
  auVar84 = vsubps_avx512vl(auVar83,auVar153);
  auVar77 = vaddps_avx512vl(auVar82,auVar76);
  auVar76 = vaddps_avx512vl(auVar83,auVar153);
  auVar75 = vshufps_avx512vl(auVar62,auVar62,0xff);
  auVar85 = vmulps_avx512vl(auVar75,auVar199);
  auVar82 = vsubps_avx512vl(auVar62,auVar85);
  auVar66 = vshufps_avx512vl(auVar81,auVar81,0xff);
  auVar65 = vmulps_avx512vl(auVar66,auVar199);
  auVar200._0_4_ = auVar65._0_4_ + auVar75._0_4_ * fVar238 * auVar78._0_4_ * fVar243;
  auVar200._4_4_ = auVar65._4_4_ + auVar75._4_4_ * fVar238 * auVar78._4_4_ * fVar243;
  auVar200._8_4_ = auVar65._8_4_ + auVar75._8_4_ * fVar238 * auVar78._8_4_ * fVar243;
  auVar200._12_4_ = auVar65._12_4_ + auVar75._12_4_ * fVar238 * auVar78._12_4_ * fVar243;
  auVar75 = vsubps_avx(auVar81,auVar200);
  auVar83 = vaddps_avx512vl(auVar62,auVar85);
  auVar85 = vaddps_avx512vl(auVar81,auVar200);
  auVar81 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar78 = vmulps_avx512vl(auVar84,auVar81);
  auVar190._0_4_ = auVar67._0_4_ + auVar78._0_4_;
  auVar190._4_4_ = auVar67._4_4_ + auVar78._4_4_;
  auVar190._8_4_ = auVar67._8_4_ + auVar78._8_4_;
  auVar190._12_4_ = auVar67._12_4_ + auVar78._12_4_;
  auVar75 = vmulps_avx512vl(auVar75,auVar81);
  auVar65 = vsubps_avx(auVar82,auVar75);
  auVar75 = vmulps_avx512vl(auVar76,auVar81);
  auVar60 = vaddps_avx512vl(auVar77,auVar75);
  auVar75 = vmulps_avx512vl(auVar85,auVar81);
  auVar61 = vsubps_avx512vl(auVar83,auVar75);
  auVar75 = *(undefined1 (*) [16])(lVar12 + lVar11 * lVar2);
  auVar78 = vmulps_avx512vl(auVar71,auVar128);
  auVar78 = vfmadd231ps_fma(auVar78,auVar70,auVar128);
  auVar84 = vxorps_avx512vl(auVar85,auVar85);
  auVar84 = vfmadd213ps_avx512vl(auVar84,auVar69,auVar78);
  auVar62 = vaddps_avx512vl(auVar68,auVar84);
  auVar78 = vfmadd231ps_avx512vl(auVar78,auVar69,auVar88);
  auVar63 = vfnmadd231ps_avx512vl(auVar78,auVar68,auVar88);
  auVar78 = vmulps_avx512vl(auVar75,auVar128);
  auVar78 = vfmadd231ps_avx512vl(auVar78,auVar74,auVar128);
  auVar84 = vxorps_avx512vl(auVar66,auVar66);
  auVar84 = vfmadd213ps_avx512vl(auVar84,auVar73,auVar78);
  auVar76 = vaddps_avx512vl(auVar72,auVar84);
  auVar78 = vfmadd231ps_avx512vl(auVar78,auVar73,auVar88);
  auVar85 = vfnmadd231ps_avx512vl(auVar78,auVar72,auVar88);
  auVar78 = vxorps_avx512vl(auVar84,auVar84);
  auVar78 = vfmadd213ps_avx512vl(auVar78,auVar70,auVar71);
  auVar78 = vfmadd231ps_avx512vl(auVar78,auVar69,auVar128);
  auVar64 = vfmadd231ps_avx512vl(auVar78,auVar68,auVar128);
  auVar78 = vmulps_avx512vl(auVar71,auVar88);
  auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar88,auVar70);
  auVar78 = vfmadd231ps_avx512vl(auVar78,auVar128,auVar69);
  auVar68 = vfnmadd231ps_avx512vl(auVar78,auVar128,auVar68);
  auVar78 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar74,auVar75);
  auVar78 = vfmadd231ps_fma(auVar78,auVar73,auVar128);
  auVar78 = vfmadd231ps_fma(auVar78,auVar72,auVar128);
  auVar75 = vmulps_avx512vl(auVar75,auVar88);
  auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar88,auVar74);
  auVar75 = vfmadd231ps_fma(auVar75,auVar128,auVar73);
  auVar66 = vfnmadd231ps_fma(auVar75,auVar128,auVar72);
  auVar75 = vshufps_avx(auVar63,auVar63,0xc9);
  auVar84 = vshufps_avx512vl(auVar76,auVar76,0xc9);
  fVar238 = auVar63._0_4_;
  auVar246._0_4_ = fVar238 * auVar84._0_4_;
  fVar239 = auVar63._4_4_;
  auVar246._4_4_ = fVar239 * auVar84._4_4_;
  fVar152 = auVar63._8_4_;
  auVar246._8_4_ = fVar152 * auVar84._8_4_;
  fVar160 = auVar63._12_4_;
  auVar246._12_4_ = fVar160 * auVar84._12_4_;
  auVar84 = vfmsub231ps_avx512vl(auVar246,auVar75,auVar76);
  auVar84 = vshufps_avx(auVar84,auVar84,0xc9);
  auVar76 = vshufps_avx512vl(auVar85,auVar85,0xc9);
  auVar256._0_4_ = fVar238 * auVar76._0_4_;
  auVar256._4_4_ = fVar239 * auVar76._4_4_;
  auVar256._8_4_ = fVar152 * auVar76._8_4_;
  auVar256._12_4_ = fVar160 * auVar76._12_4_;
  auVar75 = vfmsub231ps_avx512vl(auVar256,auVar75,auVar85);
  auVar76 = vshufps_avx(auVar75,auVar75,0xc9);
  auVar69 = vshufps_avx512vl(auVar68,auVar68,0xc9);
  auVar75 = vshufps_avx(auVar78,auVar78,0xc9);
  auVar75 = vmulps_avx512vl(auVar68,auVar75);
  auVar75 = vfmsub231ps_fma(auVar75,auVar69,auVar78);
  auVar85 = vshufps_avx(auVar75,auVar75,0xc9);
  auVar78 = vshufps_avx(auVar66,auVar66,0xc9);
  auVar75 = vdpps_avx(auVar84,auVar84,0x7f);
  auVar78 = vmulps_avx512vl(auVar68,auVar78);
  auVar78 = vfmsub231ps_fma(auVar78,auVar69,auVar66);
  auVar66 = vshufps_avx(auVar78,auVar78,0xc9);
  auVar78 = vrsqrt14ss_avx512f(auVar128,ZEXT416(auVar75._0_4_));
  auVar69 = vmulss_avx512f(auVar78,ZEXT416(0x3fc00000));
  auVar70 = vmulss_avx512f(auVar75,ZEXT416(0x3f000000));
  auVar70 = vmulss_avx512f(auVar70,auVar78);
  auVar78 = vmulss_avx512f(auVar70,ZEXT416((uint)(auVar78._0_4_ * auVar78._0_4_)));
  auVar78 = vsubss_avx512f(auVar69,auVar78);
  auVar269._0_4_ = auVar78._0_4_;
  auVar269._4_4_ = auVar269._0_4_;
  auVar269._8_4_ = auVar269._0_4_;
  auVar269._12_4_ = auVar269._0_4_;
  auVar69 = vmulps_avx512vl(auVar84,auVar269);
  auVar78 = vdpps_avx(auVar84,auVar76,0x7f);
  auVar70 = vbroadcastss_avx512vl(auVar75);
  auVar76 = vmulps_avx512vl(auVar70,auVar76);
  fVar174 = auVar78._0_4_;
  auVar178._0_4_ = auVar84._0_4_ * fVar174;
  auVar178._4_4_ = auVar84._4_4_ * fVar174;
  auVar178._8_4_ = auVar84._8_4_ * fVar174;
  auVar178._12_4_ = auVar84._12_4_ * fVar174;
  auVar84 = vsubps_avx(auVar76,auVar178);
  auVar78 = vrcp14ss_avx512f(auVar128,ZEXT416(auVar75._0_4_));
  auVar75 = vfnmadd213ss_avx512f(auVar75,auVar78,ZEXT416(0x40000000));
  fVar174 = auVar78._0_4_ * auVar75._0_4_;
  auVar75 = vdpps_avx(auVar85,auVar85,0x7f);
  auVar78 = vrsqrt14ss_avx512f(auVar128,ZEXT416(auVar75._0_4_));
  auVar76 = vmulss_avx512f(auVar78,ZEXT416(0x3fc00000));
  auVar70 = vmulss_avx512f(auVar75,ZEXT416(0x3f000000));
  fVar243 = auVar78._0_4_;
  fVar229 = auVar76._0_4_ - auVar70._0_4_ * fVar243 * fVar243 * fVar243;
  auVar263._0_4_ = auVar85._0_4_ * fVar229;
  auVar263._4_4_ = auVar85._4_4_ * fVar229;
  auVar263._8_4_ = auVar85._8_4_ * fVar229;
  auVar263._12_4_ = auVar85._12_4_ * fVar229;
  auVar78 = vdpps_avx(auVar85,auVar66,0x7f);
  auVar76 = vbroadcastss_avx512vl(auVar75);
  auVar76 = vmulps_avx512vl(auVar76,auVar66);
  fVar243 = auVar78._0_4_;
  auVar223._0_4_ = auVar85._0_4_ * fVar243;
  auVar223._4_4_ = auVar85._4_4_ * fVar243;
  auVar223._8_4_ = auVar85._8_4_ * fVar243;
  auVar223._12_4_ = auVar85._12_4_ * fVar243;
  auVar78 = vsubps_avx(auVar76,auVar223);
  auVar76 = vrcp14ss_avx512f(auVar128,ZEXT416(auVar75._0_4_));
  auVar75 = vfnmadd213ss_avx512f(auVar75,auVar76,ZEXT416(0x40000000));
  auVar74 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  fVar243 = auVar75._0_4_ * auVar76._0_4_;
  auVar76 = vshufps_avx512vl(auVar62,auVar62,0xff);
  auVar85 = vmulps_avx512vl(auVar76,auVar69);
  auVar66 = vsubps_avx512vl(auVar62,auVar85);
  auVar75 = vshufps_avx(auVar63,auVar63,0xff);
  auVar75 = vmulps_avx512vl(auVar75,auVar69);
  auVar163._0_4_ = auVar75._0_4_ + auVar76._0_4_ * auVar269._0_4_ * fVar174 * auVar84._0_4_;
  auVar163._4_4_ = auVar75._4_4_ + auVar76._4_4_ * auVar269._0_4_ * fVar174 * auVar84._4_4_;
  auVar163._8_4_ = auVar75._8_4_ + auVar76._8_4_ * auVar269._0_4_ * fVar174 * auVar84._8_4_;
  auVar163._12_4_ = auVar75._12_4_ + auVar76._12_4_ * auVar269._0_4_ * fVar174 * auVar84._12_4_;
  auVar75 = vsubps_avx(auVar63,auVar163);
  auVar84 = vaddps_avx512vl(auVar62,auVar85);
  auVar164._0_4_ = fVar238 + auVar163._0_4_;
  auVar164._4_4_ = fVar239 + auVar163._4_4_;
  auVar164._8_4_ = fVar152 + auVar163._8_4_;
  auVar164._12_4_ = fVar160 + auVar163._12_4_;
  auVar76 = vshufps_avx512vl(auVar64,auVar64,0xff);
  auVar257._0_4_ = auVar76._0_4_ * auVar263._0_4_;
  auVar257._4_4_ = auVar76._4_4_ * auVar263._4_4_;
  auVar257._8_4_ = auVar76._8_4_ * auVar263._8_4_;
  auVar257._12_4_ = auVar76._12_4_ * auVar263._12_4_;
  auVar85 = vsubps_avx512vl(auVar64,auVar257);
  auVar69 = vshufps_avx512vl(auVar68,auVar68,0xff);
  auVar69 = vmulps_avx512vl(auVar69,auVar263);
  auVar179._0_4_ = auVar69._0_4_ + auVar76._0_4_ * fVar229 * auVar78._0_4_ * fVar243;
  auVar179._4_4_ = auVar69._4_4_ + auVar76._4_4_ * fVar229 * auVar78._4_4_ * fVar243;
  auVar179._8_4_ = auVar69._8_4_ + auVar76._8_4_ * fVar229 * auVar78._8_4_ * fVar243;
  auVar179._12_4_ = auVar69._12_4_ + auVar76._12_4_ * fVar229 * auVar78._12_4_ * fVar243;
  auVar78 = vsubps_avx512vl(auVar68,auVar179);
  auVar76 = vaddps_avx512vl(auVar64,auVar257);
  auVar68 = vaddps_avx512vl(auVar68,auVar179);
  auVar75 = vmulps_avx512vl(auVar75,auVar81);
  auVar224._0_4_ = auVar66._0_4_ + auVar75._0_4_;
  auVar224._4_4_ = auVar66._4_4_ + auVar75._4_4_;
  auVar224._8_4_ = auVar66._8_4_ + auVar75._8_4_;
  auVar224._12_4_ = auVar66._12_4_ + auVar75._12_4_;
  auVar75 = vmulps_avx512vl(auVar78,auVar81);
  auVar75 = vsubps_avx(auVar85,auVar75);
  auVar78 = vmulps_avx512vl(auVar164,auVar81);
  auVar165._0_4_ = auVar84._0_4_ + auVar78._0_4_;
  auVar165._4_4_ = auVar84._4_4_ + auVar78._4_4_;
  auVar165._8_4_ = auVar84._8_4_ + auVar78._8_4_;
  auVar165._12_4_ = auVar84._12_4_ + auVar78._12_4_;
  auVar78 = vmulps_avx512vl(auVar68,auVar81);
  auVar281 = ZEXT464(0x3f800000);
  auVar78 = vsubps_avx(auVar76,auVar78);
  auVar68 = vbroadcastss_avx512vl(auVar80);
  auVar69 = vsubss_avx512f(ZEXT416(0x3f800000),auVar80);
  auVar62._0_4_ = auVar69._0_4_;
  auVar62._4_4_ = auVar62._0_4_;
  auVar62._8_4_ = auVar62._0_4_;
  auVar62._12_4_ = auVar62._0_4_;
  auVar66 = vmulps_avx512vl(auVar68,auVar66);
  auVar69 = vmulps_avx512vl(auVar68,auVar224);
  auVar75 = vmulps_avx512vl(auVar68,auVar75);
  auVar270._0_4_ = auVar68._0_4_ * auVar85._0_4_;
  auVar270._4_4_ = auVar68._4_4_ * auVar85._4_4_;
  auVar270._8_4_ = auVar68._8_4_ * auVar85._8_4_;
  auVar270._12_4_ = auVar68._12_4_ * auVar85._12_4_;
  local_540 = vfmadd231ps_avx512vl(auVar66,auVar62,auVar67);
  local_550 = vfmadd231ps_avx512vl(auVar69,auVar62,auVar190);
  local_560 = vfmadd231ps_avx512vl(auVar75,auVar62,auVar65);
  local_570 = vfmadd231ps_fma(auVar270,auVar62,auVar82);
  auVar75 = vmulps_avx512vl(auVar68,auVar84);
  auVar84 = vmulps_avx512vl(auVar68,auVar165);
  auVar78 = vmulps_avx512vl(auVar68,auVar78);
  auVar258._0_4_ = auVar68._0_4_ * auVar76._0_4_;
  auVar258._4_4_ = auVar68._4_4_ * auVar76._4_4_;
  auVar258._8_4_ = auVar68._8_4_ * auVar76._8_4_;
  auVar258._12_4_ = auVar68._12_4_ * auVar76._12_4_;
  _local_580 = vfmadd231ps_avx512vl(auVar75,auVar62,auVar77);
  _local_590 = vfmadd231ps_avx512vl(auVar84,auVar62,auVar60);
  _local_5a0 = vfmadd231ps_avx512vl(auVar78,auVar62,auVar61);
  _local_5b0 = vfmadd231ps_fma(auVar258,auVar62,auVar83);
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  fVar174 = *(float *)(ray + k * 4 + 0xc0);
  local_4c0 = vsubps_avx512vl(local_540,auVar75);
  uVar127 = local_4c0._0_4_;
  auVar136._4_4_ = uVar127;
  auVar136._0_4_ = uVar127;
  auVar136._8_4_ = uVar127;
  auVar136._12_4_ = uVar127;
  auVar78 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar84 = vshufps_avx(local_4c0,local_4c0,0xaa);
  aVar4 = pre->ray_space[k].vx.field_0;
  aVar5 = pre->ray_space[k].vy.field_0;
  fVar243 = pre->ray_space[k].vz.field_0.m128[0];
  fVar229 = pre->ray_space[k].vz.field_0.m128[1];
  fVar238 = pre->ray_space[k].vz.field_0.m128[2];
  fVar239 = pre->ray_space[k].vz.field_0.m128[3];
  auVar129._0_4_ = fVar243 * auVar84._0_4_;
  auVar129._4_4_ = fVar229 * auVar84._4_4_;
  auVar129._8_4_ = fVar238 * auVar84._8_4_;
  auVar129._12_4_ = fVar239 * auVar84._12_4_;
  auVar78 = vfmadd231ps_fma(auVar129,(undefined1  [16])aVar5,auVar78);
  auVar65 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar4,auVar136);
  local_4d0 = vsubps_avx512vl(local_550,auVar75);
  uVar127 = local_4d0._0_4_;
  auVar139._4_4_ = uVar127;
  auVar139._0_4_ = uVar127;
  auVar139._8_4_ = uVar127;
  auVar139._12_4_ = uVar127;
  auVar78 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar84 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar137._0_4_ = fVar243 * auVar84._0_4_;
  auVar137._4_4_ = fVar229 * auVar84._4_4_;
  auVar137._8_4_ = fVar238 * auVar84._8_4_;
  auVar137._12_4_ = fVar239 * auVar84._12_4_;
  auVar78 = vfmadd231ps_fma(auVar137,(undefined1  [16])aVar5,auVar78);
  auVar67 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar4,auVar139);
  local_4e0 = vsubps_avx512vl(local_560,auVar75);
  uVar127 = local_4e0._0_4_;
  auVar180._4_4_ = uVar127;
  auVar180._0_4_ = uVar127;
  auVar180._8_4_ = uVar127;
  auVar180._12_4_ = uVar127;
  auVar78 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar84 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar140._0_4_ = fVar243 * auVar84._0_4_;
  auVar140._4_4_ = fVar229 * auVar84._4_4_;
  auVar140._8_4_ = fVar238 * auVar84._8_4_;
  auVar140._12_4_ = fVar239 * auVar84._12_4_;
  auVar78 = vfmadd231ps_fma(auVar140,(undefined1  [16])aVar5,auVar78);
  auVar68 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar4,auVar180);
  local_4f0 = vsubps_avx(local_570,auVar75);
  uVar127 = local_4f0._0_4_;
  auVar201._4_4_ = uVar127;
  auVar201._0_4_ = uVar127;
  auVar201._8_4_ = uVar127;
  auVar201._12_4_ = uVar127;
  auVar78 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar84 = vshufps_avx(local_4f0,local_4f0,0xaa);
  auVar181._0_4_ = fVar243 * auVar84._0_4_;
  auVar181._4_4_ = fVar229 * auVar84._4_4_;
  auVar181._8_4_ = fVar238 * auVar84._8_4_;
  auVar181._12_4_ = fVar239 * auVar84._12_4_;
  auVar78 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar5,auVar78);
  auVar69 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar4,auVar201);
  local_500 = vsubps_avx512vl(_local_580,auVar75);
  uVar127 = local_500._0_4_;
  auVar202._4_4_ = uVar127;
  auVar202._0_4_ = uVar127;
  auVar202._8_4_ = uVar127;
  auVar202._12_4_ = uVar127;
  auVar78 = vshufps_avx(local_500,local_500,0x55);
  auVar84 = vshufps_avx(local_500,local_500,0xaa);
  auVar225._0_4_ = auVar84._0_4_ * fVar243;
  auVar225._4_4_ = auVar84._4_4_ * fVar229;
  auVar225._8_4_ = auVar84._8_4_ * fVar238;
  auVar225._12_4_ = auVar84._12_4_ * fVar239;
  auVar78 = vfmadd231ps_fma(auVar225,(undefined1  [16])aVar5,auVar78);
  auVar70 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar4,auVar202);
  local_510 = vsubps_avx512vl(_local_590,auVar75);
  uVar127 = local_510._0_4_;
  auVar203._4_4_ = uVar127;
  auVar203._0_4_ = uVar127;
  auVar203._8_4_ = uVar127;
  auVar203._12_4_ = uVar127;
  auVar78 = vshufps_avx(local_510,local_510,0x55);
  auVar84 = vshufps_avx(local_510,local_510,0xaa);
  auVar230._0_4_ = auVar84._0_4_ * fVar243;
  auVar230._4_4_ = auVar84._4_4_ * fVar229;
  auVar230._8_4_ = auVar84._8_4_ * fVar238;
  auVar230._12_4_ = auVar84._12_4_ * fVar239;
  auVar78 = vfmadd231ps_fma(auVar230,(undefined1  [16])aVar5,auVar78);
  auVar71 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar4,auVar203);
  local_520 = vsubps_avx512vl(_local_5a0,auVar75);
  uVar127 = local_520._0_4_;
  auVar204._4_4_ = uVar127;
  auVar204._0_4_ = uVar127;
  auVar204._8_4_ = uVar127;
  auVar204._12_4_ = uVar127;
  auVar78 = vshufps_avx(local_520,local_520,0x55);
  auVar84 = vshufps_avx(local_520,local_520,0xaa);
  auVar247._0_4_ = auVar84._0_4_ * fVar243;
  auVar247._4_4_ = auVar84._4_4_ * fVar229;
  auVar247._8_4_ = auVar84._8_4_ * fVar238;
  auVar247._12_4_ = auVar84._12_4_ * fVar239;
  auVar78 = vfmadd231ps_fma(auVar247,(undefined1  [16])aVar5,auVar78);
  auVar72 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar4,auVar204);
  local_530 = vsubps_avx(_local_5b0,auVar75);
  uVar127 = local_530._0_4_;
  auVar154._4_4_ = uVar127;
  auVar154._0_4_ = uVar127;
  auVar154._8_4_ = uVar127;
  auVar154._12_4_ = uVar127;
  auVar75 = vshufps_avx(local_530,local_530,0x55);
  auVar78 = vshufps_avx(local_530,local_530,0xaa);
  auVar191._0_4_ = auVar78._0_4_ * fVar243;
  auVar191._4_4_ = auVar78._4_4_ * fVar229;
  auVar191._8_4_ = auVar78._8_4_ * fVar238;
  auVar191._12_4_ = auVar78._12_4_ * fVar239;
  auVar75 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar5,auVar75);
  auVar73 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar4,auVar154);
  auVar84 = vmovlhps_avx(auVar65,auVar70);
  auVar76 = vmovlhps_avx(auVar67,auVar71);
  auVar85 = vmovlhps_avx(auVar68,auVar72);
  _local_4a0 = vmovlhps_avx512f(auVar69,auVar73);
  auVar78 = vminps_avx(auVar84,auVar76);
  auVar75 = vmaxps_avx(auVar84,auVar76);
  auVar66 = vminps_avx512vl(auVar85,_local_4a0);
  auVar78 = vminps_avx(auVar78,auVar66);
  auVar66 = vmaxps_avx512vl(auVar85,_local_4a0);
  auVar75 = vmaxps_avx(auVar75,auVar66);
  auVar66 = vshufpd_avx(auVar78,auVar78,3);
  auVar78 = vminps_avx(auVar78,auVar66);
  auVar66 = vshufpd_avx(auVar75,auVar75,3);
  auVar75 = vmaxps_avx(auVar75,auVar66);
  auVar78 = vandps_avx512vl(auVar78,auVar280._0_16_);
  auVar75 = vandps_avx512vl(auVar75,auVar280._0_16_);
  auVar75 = vmaxps_avx(auVar78,auVar75);
  auVar78 = vmovshdup_avx(auVar75);
  auVar75 = vmaxss_avx(auVar78,auVar75);
  auVar78 = vmovddup_avx512vl(auVar65);
  auVar66 = vmovddup_avx512vl(auVar67);
  auVar65 = vmovddup_avx512vl(auVar68);
  auVar67 = vmovddup_avx512vl(auVar69);
  local_4b0 = ZEXT416((uint)(auVar75._0_4_ * 9.536743e-07));
  local_440 = vbroadcastss_avx512vl(local_4b0);
  auVar75 = vxorps_avx512vl(local_440._0_16_,auVar74);
  local_460 = vbroadcastss_avx512vl(auVar75);
  uVar49 = 0;
  local_470 = vsubps_avx(auVar76,auVar84);
  local_480 = vsubps_avx(auVar85,auVar76);
  local_490 = vsubps_avx512vl(_local_4a0,auVar85);
  local_5c0 = vsubps_avx512vl(_local_580,local_540);
  local_5d0 = vsubps_avx512vl(_local_590,local_550);
  local_5e0 = vsubps_avx512vl(_local_5a0,local_560);
  _local_5f0 = vsubps_avx(_local_5b0,local_570);
  auVar134 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar134);
  auVar134 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar134);
  auVar75 = ZEXT816(0x3f80000000000000);
  auVar123._32_32_ = auVar134._32_32_;
  auVar61 = auVar75;
LAB_018c5a34:
  do {
    auVar68 = vshufps_avx(auVar61,auVar61,0x50);
    auVar264._8_4_ = 0x3f800000;
    auVar264._0_8_ = 0x3f8000003f800000;
    auVar264._12_4_ = 0x3f800000;
    auVar111._16_4_ = 0x3f800000;
    auVar111._0_16_ = auVar264;
    auVar111._20_4_ = 0x3f800000;
    auVar111._24_4_ = 0x3f800000;
    auVar111._28_4_ = 0x3f800000;
    auVar69 = vsubps_avx(auVar264,auVar68);
    fVar243 = auVar68._0_4_;
    fVar152 = auVar70._0_4_;
    auVar155._0_4_ = fVar152 * fVar243;
    fVar229 = auVar68._4_4_;
    fVar160 = auVar70._4_4_;
    auVar155._4_4_ = fVar160 * fVar229;
    fVar238 = auVar68._8_4_;
    auVar155._8_4_ = fVar152 * fVar238;
    fVar239 = auVar68._12_4_;
    auVar155._12_4_ = fVar160 * fVar239;
    fVar161 = auVar71._0_4_;
    auVar166._0_4_ = fVar161 * fVar243;
    fVar173 = auVar71._4_4_;
    auVar166._4_4_ = fVar173 * fVar229;
    auVar166._8_4_ = fVar161 * fVar238;
    auVar166._12_4_ = fVar173 * fVar239;
    fVar175 = auVar72._0_4_;
    auVar182._0_4_ = fVar175 * fVar243;
    fVar188 = auVar72._4_4_;
    auVar182._4_4_ = fVar188 * fVar229;
    auVar182._8_4_ = fVar175 * fVar238;
    auVar182._12_4_ = fVar188 * fVar239;
    fVar189 = auVar73._0_4_;
    auVar141._0_4_ = fVar189 * fVar243;
    fVar196 = auVar73._4_4_;
    auVar141._4_4_ = fVar196 * fVar229;
    auVar141._8_4_ = fVar189 * fVar238;
    auVar141._12_4_ = fVar196 * fVar239;
    auVar74 = vfmadd231ps_avx512vl(auVar155,auVar69,auVar78);
    auVar77 = vfmadd231ps_avx512vl(auVar166,auVar69,auVar66);
    auVar81 = vfmadd231ps_avx512vl(auVar182,auVar69,auVar65);
    auVar69 = vfmadd231ps_avx512vl(auVar141,auVar67,auVar69);
    auVar68 = vmovshdup_avx(auVar75);
    fVar229 = auVar75._0_4_;
    fVar243 = (auVar68._0_4_ - fVar229) * 0.04761905;
    auVar105._4_4_ = fVar229;
    auVar105._0_4_ = fVar229;
    auVar105._8_4_ = fVar229;
    auVar105._12_4_ = fVar229;
    auVar105._16_4_ = fVar229;
    auVar105._20_4_ = fVar229;
    auVar105._24_4_ = fVar229;
    auVar105._28_4_ = fVar229;
    auVar94._0_8_ = auVar68._0_8_;
    auVar94._8_8_ = auVar94._0_8_;
    auVar94._16_8_ = auVar94._0_8_;
    auVar94._24_8_ = auVar94._0_8_;
    auVar108 = vsubps_avx(auVar94,auVar105);
    uVar127 = auVar74._0_4_;
    auVar109._4_4_ = uVar127;
    auVar109._0_4_ = uVar127;
    auVar109._8_4_ = uVar127;
    auVar109._12_4_ = uVar127;
    auVar109._16_4_ = uVar127;
    auVar109._20_4_ = uVar127;
    auVar109._24_4_ = uVar127;
    auVar109._28_4_ = uVar127;
    auVar97._8_4_ = 1;
    auVar97._0_8_ = 0x100000001;
    auVar97._12_4_ = 1;
    auVar97._16_4_ = 1;
    auVar97._20_4_ = 1;
    auVar97._24_4_ = 1;
    auVar97._28_4_ = 1;
    auVar107 = ZEXT1632(auVar74);
    auVar106 = vpermps_avx2(auVar97,auVar107);
    auVar91 = vbroadcastss_avx512vl(auVar77);
    auVar101 = ZEXT1632(auVar77);
    auVar92 = vpermps_avx512vl(auVar97,auVar101);
    auVar93 = vbroadcastss_avx512vl(auVar81);
    auVar102 = ZEXT1632(auVar81);
    auVar94 = vpermps_avx512vl(auVar97,auVar102);
    auVar95 = vbroadcastss_avx512vl(auVar69);
    auVar104 = ZEXT1632(auVar69);
    auVar96 = vpermps_avx512vl(auVar97,auVar104);
    auVar110._4_4_ = fVar243;
    auVar110._0_4_ = fVar243;
    auVar110._8_4_ = fVar243;
    auVar110._12_4_ = fVar243;
    auVar110._16_4_ = fVar243;
    auVar110._20_4_ = fVar243;
    auVar110._24_4_ = fVar243;
    auVar110._28_4_ = fVar243;
    auVar103._8_4_ = 2;
    auVar103._0_8_ = 0x200000002;
    auVar103._12_4_ = 2;
    auVar103._16_4_ = 2;
    auVar103._20_4_ = 2;
    auVar103._24_4_ = 2;
    auVar103._28_4_ = 2;
    auVar97 = vpermps_avx512vl(auVar103,auVar107);
    auVar98 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar99 = vpermps_avx512vl(auVar98,auVar107);
    auVar100 = vpermps_avx512vl(auVar103,auVar101);
    auVar101 = vpermps_avx512vl(auVar98,auVar101);
    auVar107 = vpermps_avx2(auVar103,auVar102);
    auVar102 = vpermps_avx512vl(auVar98,auVar102);
    auVar103 = vpermps_avx512vl(auVar103,auVar104);
    auVar98 = vpermps_avx512vl(auVar98,auVar104);
    auVar68 = vfmadd132ps_fma(auVar108,auVar105,_DAT_01f7b040);
    auVar108 = vsubps_avx(auVar111,ZEXT1632(auVar68));
    auVar104 = vmulps_avx512vl(auVar91,ZEXT1632(auVar68));
    auVar111 = ZEXT1632(auVar68);
    auVar105 = vmulps_avx512vl(auVar92,auVar111);
    auVar69 = vfmadd231ps_fma(auVar104,auVar108,auVar109);
    auVar74 = vfmadd231ps_fma(auVar105,auVar108,auVar106);
    auVar104 = vmulps_avx512vl(auVar93,auVar111);
    auVar105 = vmulps_avx512vl(auVar94,auVar111);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar108,auVar91);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar108,auVar92);
    auVar91 = vmulps_avx512vl(auVar95,auVar111);
    auVar109 = ZEXT1632(auVar68);
    auVar92 = vmulps_avx512vl(auVar96,auVar109);
    auVar93 = vfmadd231ps_avx512vl(auVar91,auVar108,auVar93);
    auVar94 = vfmadd231ps_avx512vl(auVar92,auVar108,auVar94);
    fVar238 = auVar68._0_4_;
    fVar239 = auVar68._4_4_;
    auVar91._4_4_ = fVar239 * auVar104._4_4_;
    auVar91._0_4_ = fVar238 * auVar104._0_4_;
    fVar240 = auVar68._8_4_;
    auVar91._8_4_ = fVar240 * auVar104._8_4_;
    fVar241 = auVar68._12_4_;
    auVar91._12_4_ = fVar241 * auVar104._12_4_;
    auVar91._16_4_ = auVar104._16_4_ * 0.0;
    auVar91._20_4_ = auVar104._20_4_ * 0.0;
    auVar91._24_4_ = auVar104._24_4_ * 0.0;
    auVar91._28_4_ = fVar229;
    auVar92._4_4_ = fVar239 * auVar105._4_4_;
    auVar92._0_4_ = fVar238 * auVar105._0_4_;
    auVar92._8_4_ = fVar240 * auVar105._8_4_;
    auVar92._12_4_ = fVar241 * auVar105._12_4_;
    auVar92._16_4_ = auVar105._16_4_ * 0.0;
    auVar92._20_4_ = auVar105._20_4_ * 0.0;
    auVar92._24_4_ = auVar105._24_4_ * 0.0;
    auVar92._28_4_ = auVar106._28_4_;
    auVar69 = vfmadd231ps_fma(auVar91,auVar108,ZEXT1632(auVar69));
    auVar74 = vfmadd231ps_fma(auVar92,auVar108,ZEXT1632(auVar74));
    auVar96._0_4_ = fVar238 * auVar93._0_4_;
    auVar96._4_4_ = fVar239 * auVar93._4_4_;
    auVar96._8_4_ = fVar240 * auVar93._8_4_;
    auVar96._12_4_ = fVar241 * auVar93._12_4_;
    auVar96._16_4_ = auVar93._16_4_ * 0.0;
    auVar96._20_4_ = auVar93._20_4_ * 0.0;
    auVar96._24_4_ = auVar93._24_4_ * 0.0;
    auVar96._28_4_ = 0;
    auVar106._4_4_ = fVar239 * auVar94._4_4_;
    auVar106._0_4_ = fVar238 * auVar94._0_4_;
    auVar106._8_4_ = fVar240 * auVar94._8_4_;
    auVar106._12_4_ = fVar241 * auVar94._12_4_;
    auVar106._16_4_ = auVar94._16_4_ * 0.0;
    auVar106._20_4_ = auVar94._20_4_ * 0.0;
    auVar106._24_4_ = auVar94._24_4_ * 0.0;
    auVar106._28_4_ = auVar93._28_4_;
    auVar77 = vfmadd231ps_fma(auVar96,auVar108,auVar104);
    auVar81 = vfmadd231ps_fma(auVar106,auVar108,auVar105);
    auVar93._28_4_ = auVar105._28_4_;
    auVar93._0_28_ =
         ZEXT1628(CONCAT412(fVar241 * auVar81._12_4_,
                            CONCAT48(fVar240 * auVar81._8_4_,
                                     CONCAT44(fVar239 * auVar81._4_4_,fVar238 * auVar81._0_4_))));
    auVar80 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar241 * auVar77._12_4_,
                                                 CONCAT48(fVar240 * auVar77._8_4_,
                                                          CONCAT44(fVar239 * auVar77._4_4_,
                                                                   fVar238 * auVar77._0_4_)))),
                              auVar108,ZEXT1632(auVar69));
    auVar82 = vfmadd231ps_fma(auVar93,auVar108,ZEXT1632(auVar74));
    auVar106 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar69));
    auVar91 = vsubps_avx(ZEXT1632(auVar81),ZEXT1632(auVar74));
    auVar92 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar106 = vmulps_avx512vl(auVar106,auVar92);
    auVar91 = vmulps_avx512vl(auVar91,auVar92);
    auVar104._0_4_ = fVar243 * auVar106._0_4_;
    auVar104._4_4_ = fVar243 * auVar106._4_4_;
    auVar104._8_4_ = fVar243 * auVar106._8_4_;
    auVar104._12_4_ = fVar243 * auVar106._12_4_;
    auVar104._16_4_ = fVar243 * auVar106._16_4_;
    auVar104._20_4_ = fVar243 * auVar106._20_4_;
    auVar104._24_4_ = fVar243 * auVar106._24_4_;
    auVar104._28_4_ = 0;
    auVar106 = vmulps_avx512vl(auVar110,auVar91);
    auVar74 = vxorps_avx512vl(auVar95._0_16_,auVar95._0_16_);
    auVar91 = vpermt2ps_avx512vl(ZEXT1632(auVar80),_DAT_01fb9fc0,ZEXT1632(auVar74));
    auVar93 = vpermt2ps_avx512vl(ZEXT1632(auVar82),_DAT_01fb9fc0,ZEXT1632(auVar74));
    auVar144._0_4_ = auVar104._0_4_ + auVar80._0_4_;
    auVar144._4_4_ = auVar104._4_4_ + auVar80._4_4_;
    auVar144._8_4_ = auVar104._8_4_ + auVar80._8_4_;
    auVar144._12_4_ = auVar104._12_4_ + auVar80._12_4_;
    auVar144._16_4_ = auVar104._16_4_ + 0.0;
    auVar144._20_4_ = auVar104._20_4_ + 0.0;
    auVar144._24_4_ = auVar104._24_4_ + 0.0;
    auVar144._28_4_ = 0;
    auVar105 = ZEXT1632(auVar74);
    auVar94 = vpermt2ps_avx512vl(auVar104,_DAT_01fb9fc0,auVar105);
    auVar95 = vaddps_avx512vl(ZEXT1632(auVar82),auVar106);
    auVar96 = vpermt2ps_avx512vl(auVar106,_DAT_01fb9fc0,auVar105);
    auVar106 = vsubps_avx(auVar91,auVar94);
    auVar94 = vsubps_avx512vl(auVar93,auVar96);
    auVar96 = vmulps_avx512vl(auVar100,auVar109);
    auVar104 = vmulps_avx512vl(auVar101,auVar109);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar108,auVar97);
    auVar97 = vfmadd231ps_avx512vl(auVar104,auVar108,auVar99);
    auVar99 = vmulps_avx512vl(auVar107,auVar109);
    auVar104 = vmulps_avx512vl(auVar102,auVar109);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar108,auVar100);
    auVar100 = vfmadd231ps_avx512vl(auVar104,auVar108,auVar101);
    auVar101 = vmulps_avx512vl(auVar103,auVar109);
    auVar98 = vmulps_avx512vl(auVar98,auVar109);
    auVar69 = vfmadd231ps_fma(auVar101,auVar108,auVar107);
    auVar107 = vfmadd231ps_avx512vl(auVar98,auVar108,auVar102);
    auVar98 = vmulps_avx512vl(auVar109,auVar99);
    auVar103 = ZEXT1632(auVar68);
    auVar101 = vmulps_avx512vl(auVar103,auVar100);
    auVar96 = vfmadd231ps_avx512vl(auVar98,auVar108,auVar96);
    auVar97 = vfmadd231ps_avx512vl(auVar101,auVar108,auVar97);
    auVar107 = vmulps_avx512vl(auVar103,auVar107);
    auVar98 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar241 * auVar69._12_4_,
                                            CONCAT48(fVar240 * auVar69._8_4_,
                                                     CONCAT44(fVar239 * auVar69._4_4_,
                                                              fVar238 * auVar69._0_4_)))),auVar108,
                         auVar99);
    auVar99 = vfmadd231ps_avx512vl(auVar107,auVar108,auVar100);
    auVar107._4_4_ = fVar239 * auVar98._4_4_;
    auVar107._0_4_ = fVar238 * auVar98._0_4_;
    auVar107._8_4_ = fVar240 * auVar98._8_4_;
    auVar107._12_4_ = fVar241 * auVar98._12_4_;
    auVar107._16_4_ = auVar98._16_4_ * 0.0;
    auVar107._20_4_ = auVar98._20_4_ * 0.0;
    auVar107._24_4_ = auVar98._24_4_ * 0.0;
    auVar107._28_4_ = auVar102._28_4_;
    auVar100 = vmulps_avx512vl(auVar103,auVar99);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar108,auVar96);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar97,auVar108);
    auVar108 = vsubps_avx512vl(auVar98,auVar96);
    auVar96 = vsubps_avx512vl(auVar99,auVar97);
    auVar97 = vmulps_avx512vl(auVar108,auVar92);
    auVar92 = vmulps_avx512vl(auVar96,auVar92);
    fVar229 = fVar243 * auVar97._0_4_;
    fVar238 = fVar243 * auVar97._4_4_;
    auVar108._4_4_ = fVar238;
    auVar108._0_4_ = fVar229;
    fVar239 = fVar243 * auVar97._8_4_;
    auVar108._8_4_ = fVar239;
    fVar240 = fVar243 * auVar97._12_4_;
    auVar108._12_4_ = fVar240;
    fVar241 = fVar243 * auVar97._16_4_;
    auVar108._16_4_ = fVar241;
    fVar242 = fVar243 * auVar97._20_4_;
    auVar108._20_4_ = fVar242;
    fVar243 = fVar243 * auVar97._24_4_;
    auVar108._24_4_ = fVar243;
    auVar108._28_4_ = auVar97._28_4_;
    auVar92 = vmulps_avx512vl(auVar110,auVar92);
    auVar96 = vpermt2ps_avx512vl(auVar107,_DAT_01fb9fc0,auVar105);
    auVar98 = vpermt2ps_avx512vl(auVar100,_DAT_01fb9fc0,auVar105);
    auVar228._0_4_ = auVar107._0_4_ + fVar229;
    auVar228._4_4_ = auVar107._4_4_ + fVar238;
    auVar228._8_4_ = auVar107._8_4_ + fVar239;
    auVar228._12_4_ = auVar107._12_4_ + fVar240;
    auVar228._16_4_ = auVar107._16_4_ + fVar241;
    auVar228._20_4_ = auVar107._20_4_ + fVar242;
    auVar228._24_4_ = auVar107._24_4_ + fVar243;
    auVar228._28_4_ = auVar107._28_4_ + auVar97._28_4_;
    auVar108 = vpermt2ps_avx512vl(auVar108,_DAT_01fb9fc0,ZEXT1632(auVar74));
    auVar97 = vaddps_avx512vl(auVar100,auVar92);
    auVar92 = vpermt2ps_avx512vl(auVar92,_DAT_01fb9fc0,ZEXT1632(auVar74));
    auVar108 = vsubps_avx(auVar96,auVar108);
    auVar92 = vsubps_avx512vl(auVar98,auVar92);
    auVar159 = ZEXT1632(auVar80);
    auVar99 = vsubps_avx512vl(auVar107,auVar159);
    auVar172 = ZEXT1632(auVar82);
    auVar101 = vsubps_avx512vl(auVar100,auVar172);
    auVar102 = vsubps_avx512vl(auVar96,auVar91);
    auVar99 = vaddps_avx512vl(auVar99,auVar102);
    auVar102 = vsubps_avx512vl(auVar98,auVar93);
    auVar101 = vaddps_avx512vl(auVar101,auVar102);
    auVar102 = vmulps_avx512vl(auVar172,auVar99);
    auVar102 = vfnmadd231ps_avx512vl(auVar102,auVar159,auVar101);
    auVar103 = vmulps_avx512vl(auVar95,auVar99);
    auVar103 = vfnmadd231ps_avx512vl(auVar103,auVar144,auVar101);
    auVar104 = vmulps_avx512vl(auVar94,auVar99);
    auVar104 = vfnmadd231ps_avx512vl(auVar104,auVar106,auVar101);
    auVar105 = vmulps_avx512vl(auVar93,auVar99);
    auVar105 = vfnmadd231ps_avx512vl(auVar105,auVar91,auVar101);
    auVar109 = vmulps_avx512vl(auVar100,auVar99);
    auVar109 = vfnmadd231ps_avx512vl(auVar109,auVar107,auVar101);
    auVar110 = vmulps_avx512vl(auVar97,auVar99);
    auVar110 = vfnmadd231ps_avx512vl(auVar110,auVar228,auVar101);
    auVar111 = vmulps_avx512vl(auVar92,auVar99);
    auVar111 = vfnmadd231ps_avx512vl(auVar111,auVar108,auVar101);
    auVar99 = vmulps_avx512vl(auVar98,auVar99);
    auVar99 = vfnmadd231ps_avx512vl(auVar99,auVar96,auVar101);
    auVar101 = vminps_avx512vl(auVar102,auVar103);
    auVar102 = vmaxps_avx512vl(auVar102,auVar103);
    auVar103 = vminps_avx512vl(auVar104,auVar105);
    auVar101 = vminps_avx512vl(auVar101,auVar103);
    auVar103 = vmaxps_avx512vl(auVar104,auVar105);
    auVar102 = vmaxps_avx512vl(auVar102,auVar103);
    auVar103 = vminps_avx512vl(auVar109,auVar110);
    auVar104 = vmaxps_avx512vl(auVar109,auVar110);
    auVar105 = vminps_avx512vl(auVar111,auVar99);
    auVar103 = vminps_avx512vl(auVar103,auVar105);
    auVar101 = vminps_avx512vl(auVar101,auVar103);
    auVar99 = vmaxps_avx512vl(auVar111,auVar99);
    auVar99 = vmaxps_avx512vl(auVar104,auVar99);
    auVar99 = vmaxps_avx512vl(auVar102,auVar99);
    auVar68 = auVar99._0_16_;
    uVar26 = vcmpps_avx512vl(auVar101,local_440,2);
    uVar27 = vcmpps_avx512vl(auVar99,local_460,5);
    bVar47 = (byte)uVar26 & (byte)uVar27 & 0x7f;
    if (bVar47 != 0) {
      auVar99 = vsubps_avx512vl(auVar91,auVar159);
      auVar101 = vsubps_avx512vl(auVar93,auVar172);
      auVar102 = vsubps_avx512vl(auVar96,auVar107);
      auVar99 = vaddps_avx512vl(auVar99,auVar102);
      auVar68 = auVar99._0_16_;
      auVar102 = vsubps_avx512vl(auVar98,auVar100);
      auVar101 = vaddps_avx512vl(auVar101,auVar102);
      auVar102 = vmulps_avx512vl(auVar172,auVar99);
      auVar102 = vfnmadd231ps_avx512vl(auVar102,auVar101,auVar159);
      auVar95 = vmulps_avx512vl(auVar95,auVar99);
      auVar95 = vfnmadd213ps_avx512vl(auVar144,auVar101,auVar95);
      auVar94 = vmulps_avx512vl(auVar94,auVar99);
      auVar94 = vfnmadd213ps_avx512vl(auVar106,auVar101,auVar94);
      auVar106 = vmulps_avx512vl(auVar93,auVar99);
      auVar93 = vfnmadd231ps_avx512vl(auVar106,auVar101,auVar91);
      auVar106 = vmulps_avx512vl(auVar100,auVar99);
      auVar100 = vfnmadd231ps_avx512vl(auVar106,auVar101,auVar107);
      auVar106 = vmulps_avx512vl(auVar97,auVar99);
      auVar97 = vfnmadd213ps_avx512vl(auVar228,auVar101,auVar106);
      auVar106 = vmulps_avx512vl(auVar92,auVar99);
      auVar103 = vfnmadd213ps_avx512vl(auVar108,auVar101,auVar106);
      auVar108 = vmulps_avx512vl(auVar98,auVar99);
      auVar96 = vfnmadd231ps_avx512vl(auVar108,auVar96,auVar101);
      auVar106 = vminps_avx(auVar102,auVar95);
      auVar108 = vmaxps_avx(auVar102,auVar95);
      auVar91 = vminps_avx(auVar94,auVar93);
      auVar91 = vminps_avx(auVar106,auVar91);
      auVar106 = vmaxps_avx(auVar94,auVar93);
      auVar108 = vmaxps_avx(auVar108,auVar106);
      auVar107 = vminps_avx(auVar100,auVar97);
      auVar106 = vmaxps_avx(auVar100,auVar97);
      auVar92 = vminps_avx(auVar103,auVar96);
      auVar107 = vminps_avx(auVar107,auVar92);
      auVar107 = vminps_avx(auVar91,auVar107);
      auVar91 = vmaxps_avx(auVar103,auVar96);
      auVar106 = vmaxps_avx(auVar106,auVar91);
      auVar108 = vmaxps_avx(auVar108,auVar106);
      uVar26 = vcmpps_avx512vl(auVar108,local_460,5);
      uVar27 = vcmpps_avx512vl(auVar107,local_440,2);
      bVar47 = bVar47 & (byte)uVar26 & (byte)uVar27;
      if (bVar47 != 0) {
        auStack_610[uVar49] = (uint)bVar47;
        uVar26 = vmovlps_avx(auVar75);
        (&uStack_420)[uVar49] = uVar26;
        uVar3 = vmovlps_avx(auVar61);
        auStack_3a0[uVar49] = uVar3;
        uVar49 = (ulong)((int)uVar49 + 1);
      }
    }
    auVar75 = vxorps_avx512vl(auVar68,auVar68);
    auVar134 = ZEXT1664(auVar75);
    auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar279 = ZEXT1664(auVar75);
    auVar108 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar276 = ZEXT3264(auVar108);
    auVar75 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar277 = ZEXT1664(auVar75);
    auVar282._32_32_ = auVar123._32_32_;
    auVar282._0_32_ = _DAT_01fb9fe0;
    auVar278 = ZEXT3264(_DAT_01fb9fe0);
    auVar124._16_48_ = auVar282._16_48_;
    auVar124._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar282 = ZEXT1664(auVar124._0_16_);
LAB_018c5f34:
    do {
      do {
        do {
          auVar68 = auVar134._0_16_;
          auVar69 = auVar279._0_16_;
          if ((int)uVar49 == 0) {
            uVar127 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar31._4_4_ = uVar127;
            auVar31._0_4_ = uVar127;
            auVar31._8_4_ = uVar127;
            auVar31._12_4_ = uVar127;
            uVar26 = vcmpps_avx512vl(local_600,auVar31,2);
            uVar55 = (ulong)((uint)uVar55 & (uint)uVar55 + 0xf & (uint)uVar26);
            goto LAB_018c4f2b;
          }
          uVar48 = (int)uVar49 - 1;
          uVar50 = (ulong)uVar48;
          uVar8 = auStack_610[uVar50];
          auVar61._8_8_ = 0;
          auVar61._0_8_ = auStack_3a0[uVar50];
          uVar3 = 0;
          for (uVar54 = (ulong)uVar8; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000)
          {
            uVar3 = uVar3 + 1;
          }
          uVar51 = uVar8 - 1 & uVar8;
          bVar58 = uVar51 == 0;
          auStack_610[uVar50] = uVar51;
          if (bVar58) {
            uVar49 = (ulong)uVar48;
          }
          auVar130._8_8_ = 0;
          auVar130._0_8_ = uVar3;
          auVar75 = vpunpcklqdq_avx(auVar130,ZEXT416((int)uVar3 + 1));
          auVar123._32_32_ = auVar124._32_32_;
          auVar75 = vcvtqq2ps_avx512vl(auVar75);
          auVar75 = vmulps_avx512vl(auVar75,auVar277._0_16_);
          uVar127 = *(undefined4 *)((long)&uStack_420 + uVar50 * 8 + 4);
          auVar28._4_4_ = uVar127;
          auVar28._0_4_ = uVar127;
          auVar28._8_4_ = uVar127;
          auVar28._12_4_ = uVar127;
          auVar74 = vmulps_avx512vl(auVar75,auVar28);
          auVar146._8_4_ = 0x3f800000;
          auVar146._0_8_ = 0x3f8000003f800000;
          auVar146._12_4_ = 0x3f800000;
          auVar75 = vsubps_avx(auVar146,auVar75);
          uVar127 = *(undefined4 *)(&uStack_420 + uVar50);
          auVar29._4_4_ = uVar127;
          auVar29._0_4_ = uVar127;
          auVar29._8_4_ = uVar127;
          auVar29._12_4_ = uVar127;
          auVar75 = vfmadd231ps_avx512vl(auVar74,auVar75,auVar29);
          auVar74 = vmovshdup_avx(auVar75);
          fVar243 = auVar74._0_4_ - auVar75._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar243));
          if (uVar8 == 0 || bVar58) goto LAB_018c5a34;
          auVar74 = vshufps_avx(auVar61,auVar61,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar243));
          auVar156._8_4_ = 0x3f800000;
          auVar156._0_8_ = 0x3f8000003f800000;
          auVar156._12_4_ = 0x3f800000;
          auVar77 = vsubps_avx(auVar156,auVar74);
          fVar229 = auVar74._0_4_;
          auVar167._0_4_ = fVar229 * fVar152;
          fVar238 = auVar74._4_4_;
          auVar167._4_4_ = fVar238 * fVar160;
          fVar239 = auVar74._8_4_;
          auVar167._8_4_ = fVar239 * fVar152;
          fVar240 = auVar74._12_4_;
          auVar167._12_4_ = fVar240 * fVar160;
          auVar183._0_4_ = fVar229 * fVar161;
          auVar183._4_4_ = fVar238 * fVar173;
          auVar183._8_4_ = fVar239 * fVar161;
          auVar183._12_4_ = fVar240 * fVar173;
          auVar192._0_4_ = fVar229 * fVar175;
          auVar192._4_4_ = fVar238 * fVar188;
          auVar192._8_4_ = fVar239 * fVar175;
          auVar192._12_4_ = fVar240 * fVar188;
          auVar147._0_4_ = fVar229 * fVar189;
          auVar147._4_4_ = fVar238 * fVar196;
          auVar147._8_4_ = fVar239 * fVar189;
          auVar147._12_4_ = fVar240 * fVar196;
          auVar74 = vfmadd231ps_fma(auVar167,auVar77,auVar78);
          auVar81 = vfmadd231ps_fma(auVar183,auVar77,auVar66);
          auVar80 = vfmadd231ps_fma(auVar192,auVar77,auVar65);
          auVar77 = vfmadd231ps_fma(auVar147,auVar77,auVar67);
          auVar95._16_16_ = auVar74;
          auVar95._0_16_ = auVar74;
          auVar98._16_16_ = auVar81;
          auVar98._0_16_ = auVar81;
          auVar100._16_16_ = auVar80;
          auVar100._0_16_ = auVar80;
          auVar106 = vpermps_avx512vl(auVar278._0_32_,ZEXT1632(auVar75));
          auVar108 = vsubps_avx(auVar98,auVar95);
          auVar81 = vfmadd213ps_fma(auVar108,auVar106,auVar95);
          auVar108 = vsubps_avx(auVar100,auVar98);
          auVar82 = vfmadd213ps_fma(auVar108,auVar106,auVar98);
          auVar74 = vsubps_avx(auVar77,auVar80);
          auVar99._16_16_ = auVar74;
          auVar99._0_16_ = auVar74;
          auVar74 = vfmadd213ps_fma(auVar99,auVar106,auVar100);
          auVar108 = vsubps_avx(ZEXT1632(auVar82),ZEXT1632(auVar81));
          auVar77 = vfmadd213ps_fma(auVar108,auVar106,ZEXT1632(auVar81));
          auVar108 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar82));
          auVar74 = vfmadd213ps_fma(auVar108,auVar106,ZEXT1632(auVar82));
          auVar108 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar77));
          auVar79 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar108,auVar106);
          auVar123._0_32_ = vmulps_avx512vl(auVar108,auVar276._0_32_);
          auVar124._16_48_ = auVar123._16_48_;
          auVar74 = vmulss_avx512f(ZEXT416((uint)fVar243),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar229 = auVar74._0_4_;
          auVar193._0_8_ =
               CONCAT44(auVar79._4_4_ + fVar229 * auVar123._4_4_,
                        auVar79._0_4_ + fVar229 * auVar123._0_4_);
          auVar193._8_4_ = auVar79._8_4_ + fVar229 * auVar123._8_4_;
          auVar193._12_4_ = auVar79._12_4_ + fVar229 * auVar123._12_4_;
          auVar168._0_4_ = fVar229 * auVar123._16_4_;
          auVar168._4_4_ = fVar229 * auVar123._20_4_;
          auVar168._8_4_ = fVar229 * auVar123._24_4_;
          auVar168._12_4_ = fVar229 * auVar123._28_4_;
          auVar63 = vsubps_avx((undefined1  [16])0x0,auVar168);
          auVar82 = vshufpd_avx(auVar79,auVar79,3);
          auVar83 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar74 = vsubps_avx(auVar82,auVar79);
          auVar77 = vsubps_avx(auVar83,(undefined1  [16])0x0);
          auVar215._0_4_ = auVar74._0_4_ + auVar77._0_4_;
          auVar215._4_4_ = auVar74._4_4_ + auVar77._4_4_;
          auVar215._8_4_ = auVar74._8_4_ + auVar77._8_4_;
          auVar215._12_4_ = auVar74._12_4_ + auVar77._12_4_;
          auVar74 = vshufps_avx(auVar79,auVar79,0xb1);
          auVar77 = vshufps_avx(auVar193,auVar193,0xb1);
          auVar81 = vshufps_avx(auVar63,auVar63,0xb1);
          auVar80 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar265._4_4_ = auVar215._0_4_;
          auVar265._0_4_ = auVar215._0_4_;
          auVar265._8_4_ = auVar215._0_4_;
          auVar265._12_4_ = auVar215._0_4_;
          auVar60 = vshufps_avx(auVar215,auVar215,0x55);
          fVar229 = auVar60._0_4_;
          auVar226._0_4_ = auVar74._0_4_ * fVar229;
          fVar238 = auVar60._4_4_;
          auVar226._4_4_ = auVar74._4_4_ * fVar238;
          fVar239 = auVar60._8_4_;
          auVar226._8_4_ = auVar74._8_4_ * fVar239;
          fVar240 = auVar60._12_4_;
          auVar226._12_4_ = auVar74._12_4_ * fVar240;
          auVar231._0_4_ = auVar77._0_4_ * fVar229;
          auVar231._4_4_ = auVar77._4_4_ * fVar238;
          auVar231._8_4_ = auVar77._8_4_ * fVar239;
          auVar231._12_4_ = auVar77._12_4_ * fVar240;
          auVar248._0_4_ = auVar81._0_4_ * fVar229;
          auVar248._4_4_ = auVar81._4_4_ * fVar238;
          auVar248._8_4_ = auVar81._8_4_ * fVar239;
          auVar248._12_4_ = auVar81._12_4_ * fVar240;
          auVar216._0_4_ = auVar80._0_4_ * fVar229;
          auVar216._4_4_ = auVar80._4_4_ * fVar238;
          auVar216._8_4_ = auVar80._8_4_ * fVar239;
          auVar216._12_4_ = auVar80._12_4_ * fVar240;
          auVar74 = vfmadd231ps_fma(auVar226,auVar265,auVar79);
          auVar77 = vfmadd231ps_fma(auVar231,auVar265,auVar193);
          auVar64 = vfmadd231ps_fma(auVar248,auVar265,auVar63);
          auVar88 = vfmadd231ps_fma(auVar216,(undefined1  [16])0x0,auVar265);
          auVar60 = vshufpd_avx(auVar74,auVar74,1);
          auVar62 = vshufpd_avx(auVar77,auVar77,1);
          auVar86 = vshufpd_avx512vl(auVar64,auVar64,1);
          auVar87 = vshufpd_avx512vl(auVar88,auVar88,1);
          auVar81 = vminss_avx(auVar74,auVar77);
          auVar74 = vmaxss_avx(auVar77,auVar74);
          auVar80 = vminss_avx(auVar64,auVar88);
          auVar77 = vmaxss_avx(auVar88,auVar64);
          auVar81 = vminss_avx(auVar81,auVar80);
          auVar74 = vmaxss_avx(auVar77,auVar74);
          auVar80 = vminss_avx(auVar60,auVar62);
          auVar77 = vmaxss_avx(auVar62,auVar60);
          auVar60 = vminss_avx512f(auVar86,auVar87);
          auVar62 = vmaxss_avx512f(auVar87,auVar86);
          auVar77 = vmaxss_avx(auVar62,auVar77);
          auVar124._0_16_ = vminss_avx512f(auVar80,auVar60);
          vucomiss_avx512f(auVar81);
          fVar238 = auVar77._0_4_;
          fVar229 = auVar74._0_4_;
          if (4 < (uint)uVar49) {
            bVar59 = fVar238 == -0.0001;
            bVar56 = NAN(fVar238);
            if (fVar238 <= -0.0001) goto LAB_018c6167;
            break;
          }
LAB_018c6167:
          auVar80 = vucomiss_avx512f(auVar124._0_16_);
          bVar59 = fVar238 <= -0.0001;
          bVar57 = -0.0001 < fVar229;
          bVar56 = bVar59;
          if (!bVar59) break;
          uVar26 = vcmpps_avx512vl(auVar81,auVar80,5);
          uVar27 = vcmpps_avx512vl(auVar124._0_16_,auVar80,5);
          bVar47 = (byte)uVar26 & (byte)uVar27 & 1;
          bVar59 = bVar57 && bVar47 == 0;
          bVar56 = bVar57 && bVar47 == 0;
        } while (!bVar57 || bVar47 != 0);
        vcmpss_avx512f(auVar81,auVar68,1);
        auVar62 = auVar281._0_16_;
        uVar26 = vcmpss_avx512f(auVar74,auVar68,1);
        bVar57 = (bool)((byte)uVar26 & 1);
        auVar112._16_48_ = auVar124._16_48_;
        auVar112._0_16_ = auVar62;
        iVar126 = auVar281._0_4_;
        auVar125._4_60_ = auVar112._4_60_;
        auVar125._0_4_ = (float)((uint)bVar57 * -0x40800000 + (uint)!bVar57 * iVar126);
        vucomiss_avx512f(auVar125._0_16_);
        bVar56 = (bool)(!bVar59 | bVar56);
        bVar57 = bVar56 == false;
        auVar114._16_48_ = auVar124._16_48_;
        auVar114._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar113._4_60_ = auVar114._4_60_;
        auVar113._0_4_ = (uint)bVar56 * auVar134._0_4_ + (uint)!bVar56 * 0x7f800000;
        auVar60 = auVar113._0_16_;
        auVar116._16_48_ = auVar124._16_48_;
        auVar116._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar115._4_60_ = auVar116._4_60_;
        auVar115._0_4_ = (uint)bVar56 * auVar134._0_4_ + (uint)!bVar56 * -0x800000;
        auVar80 = auVar115._0_16_;
        uVar26 = vcmpss_avx512f(auVar124._0_16_,auVar68,1);
        bVar59 = (bool)((byte)uVar26 & 1);
        auVar118._16_48_ = auVar124._16_48_;
        auVar118._0_16_ = auVar62;
        auVar117._4_60_ = auVar118._4_60_;
        auVar117._0_4_ = (float)((uint)bVar59 * -0x40800000 + (uint)!bVar59 * iVar126);
        vucomiss_avx512f(auVar117._0_16_);
        if ((bVar56) || (bVar57)) {
          auVar64 = vucomiss_avx512f(auVar81);
          if ((bVar56) || (bVar57)) {
            auVar88 = vxorps_avx512vl(auVar81,auVar282._0_16_);
            auVar81 = vsubss_avx512f(auVar64,auVar81);
            auVar81 = vdivss_avx512f(auVar88,auVar81);
            auVar64 = vsubss_avx512f(auVar62,auVar81);
            auVar81 = vfmadd213ss_avx512f(auVar64,auVar68,auVar81);
            auVar64 = auVar81;
          }
          else {
            auVar64 = vxorps_avx512vl(auVar64,auVar64);
            vucomiss_avx512f(auVar64);
            if ((bVar56) || (auVar81 = auVar62, bVar57)) {
              auVar81 = SUB6416(ZEXT464(0xff800000),0);
              auVar64 = ZEXT416(0x7f800000);
            }
          }
          auVar60 = vminss_avx512f(auVar60,auVar64);
          auVar80 = vmaxss_avx(auVar81,auVar80);
        }
        uVar26 = vcmpss_avx512f(auVar77,auVar68,1);
        bVar59 = (bool)((byte)uVar26 & 1);
        fVar239 = (float)((uint)bVar59 * -0x40800000 + (uint)!bVar59 * iVar126);
        if ((auVar125._0_4_ != fVar239) || (NAN(auVar125._0_4_) || NAN(fVar239))) {
          if ((fVar238 != fVar229) || (NAN(fVar238) || NAN(fVar229))) {
            auVar74 = vxorps_avx512vl(auVar74,auVar282._0_16_);
            auVar217._0_4_ = auVar74._0_4_ / (fVar238 - fVar229);
            auVar217._4_12_ = auVar74._4_12_;
            auVar74 = vsubss_avx512f(auVar62,auVar217);
            auVar74 = vfmadd213ss_avx512f(auVar74,auVar68,auVar217);
            auVar77 = auVar74;
          }
          else if ((fVar229 != 0.0) ||
                  (auVar74 = auVar62, auVar77 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar229))) {
            auVar74 = SUB6416(ZEXT464(0xff800000),0);
            auVar77 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar60 = vminss_avx(auVar60,auVar77);
          auVar80 = vmaxss_avx(auVar74,auVar80);
        }
        bVar59 = auVar117._0_4_ != fVar239;
        auVar74 = vminss_avx512f(auVar60,auVar62);
        auVar120._16_48_ = auVar124._16_48_;
        auVar120._0_16_ = auVar60;
        auVar119._4_60_ = auVar120._4_60_;
        auVar119._0_4_ = (uint)bVar59 * auVar74._0_4_ + (uint)!bVar59 * auVar60._0_4_;
        auVar74 = vmaxss_avx512f(auVar62,auVar80);
        auVar122._16_48_ = auVar124._16_48_;
        auVar122._0_16_ = auVar80;
        auVar121._4_60_ = auVar122._4_60_;
        auVar121._0_4_ = (uint)bVar59 * auVar74._0_4_ + (uint)!bVar59 * auVar80._0_4_;
        auVar74 = vmaxss_avx512f(auVar68,auVar119._0_16_);
        auVar124._0_16_ = vminss_avx512f(auVar121._0_16_,auVar62);
      } while (auVar124._0_4_ < auVar74._0_4_);
      auVar64 = vmaxss_avx512f(auVar68,ZEXT416((uint)(auVar74._0_4_ + -0.1)));
      auVar88 = vminss_avx512f(ZEXT416((uint)(auVar124._0_4_ + 0.1)),auVar62);
      auVar148._0_8_ = auVar79._0_8_;
      auVar148._8_8_ = auVar148._0_8_;
      auVar232._8_8_ = auVar193._0_8_;
      auVar232._0_8_ = auVar193._0_8_;
      auVar249._8_8_ = auVar63._0_8_;
      auVar249._0_8_ = auVar63._0_8_;
      auVar74 = vshufpd_avx(auVar193,auVar193,3);
      auVar77 = vshufpd_avx(auVar63,auVar63,3);
      auVar81 = vshufps_avx(auVar64,auVar88,0);
      auVar266._8_4_ = 0x3f800000;
      auVar266._0_8_ = 0x3f8000003f800000;
      auVar266._12_4_ = 0x3f800000;
      auVar80 = vsubps_avx(auVar266,auVar81);
      fVar229 = auVar81._0_4_;
      auVar184._0_4_ = fVar229 * auVar82._0_4_;
      fVar238 = auVar81._4_4_;
      auVar184._4_4_ = fVar238 * auVar82._4_4_;
      fVar239 = auVar81._8_4_;
      auVar184._8_4_ = fVar239 * auVar82._8_4_;
      fVar240 = auVar81._12_4_;
      auVar184._12_4_ = fVar240 * auVar82._12_4_;
      auVar194._0_4_ = fVar229 * auVar74._0_4_;
      auVar194._4_4_ = fVar238 * auVar74._4_4_;
      auVar194._8_4_ = fVar239 * auVar74._8_4_;
      auVar194._12_4_ = fVar240 * auVar74._12_4_;
      auVar271._0_4_ = auVar77._0_4_ * fVar229;
      auVar271._4_4_ = auVar77._4_4_ * fVar238;
      auVar271._8_4_ = auVar77._8_4_ * fVar239;
      auVar271._12_4_ = auVar77._12_4_ * fVar240;
      auVar169._0_4_ = fVar229 * auVar83._0_4_;
      auVar169._4_4_ = fVar238 * auVar83._4_4_;
      auVar169._8_4_ = fVar239 * auVar83._8_4_;
      auVar169._12_4_ = fVar240 * auVar83._12_4_;
      auVar82 = vfmadd231ps_fma(auVar184,auVar80,auVar148);
      auVar83 = vfmadd231ps_fma(auVar194,auVar80,auVar232);
      auVar60 = vfmadd231ps_fma(auVar271,auVar80,auVar249);
      auVar63 = vfmadd231ps_fma(auVar169,auVar80,ZEXT816(0));
      auVar77 = vsubss_avx512f(auVar62,auVar64);
      auVar74 = vmovshdup_avx(auVar61);
      auVar79 = vfmadd231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar64._0_4_)),auVar61,auVar77);
      auVar77 = vsubss_avx512f(auVar62,auVar88);
      auVar86 = vfmadd231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar88._0_4_)),auVar61,auVar77);
      auVar61 = vdivss_avx512f(auVar62,ZEXT416((uint)fVar243));
      auVar74 = vsubps_avx(auVar83,auVar82);
      auVar81 = vmulps_avx512vl(auVar74,auVar69);
      auVar74 = vsubps_avx(auVar60,auVar83);
      auVar80 = vmulps_avx512vl(auVar74,auVar69);
      auVar74 = vsubps_avx(auVar63,auVar60);
      auVar74 = vmulps_avx512vl(auVar74,auVar69);
      auVar77 = vminps_avx(auVar80,auVar74);
      auVar74 = vmaxps_avx(auVar80,auVar74);
      auVar77 = vminps_avx(auVar81,auVar77);
      auVar74 = vmaxps_avx(auVar81,auVar74);
      auVar81 = vshufpd_avx(auVar77,auVar77,3);
      auVar80 = vshufpd_avx(auVar74,auVar74,3);
      auVar77 = vminps_avx(auVar77,auVar81);
      auVar74 = vmaxps_avx(auVar74,auVar80);
      fVar243 = auVar61._0_4_;
      auVar218._0_4_ = auVar77._0_4_ * fVar243;
      auVar218._4_4_ = auVar77._4_4_ * fVar243;
      auVar218._8_4_ = auVar77._8_4_ * fVar243;
      auVar218._12_4_ = auVar77._12_4_ * fVar243;
      auVar205._0_4_ = fVar243 * auVar74._0_4_;
      auVar205._4_4_ = fVar243 * auVar74._4_4_;
      auVar205._8_4_ = fVar243 * auVar74._8_4_;
      auVar205._12_4_ = fVar243 * auVar74._12_4_;
      auVar61 = vdivss_avx512f(auVar62,ZEXT416((uint)(auVar86._0_4_ - auVar79._0_4_)));
      auVar74 = vshufpd_avx(auVar82,auVar82,3);
      auVar77 = vshufpd_avx(auVar83,auVar83,3);
      auVar81 = vshufpd_avx(auVar60,auVar60,3);
      auVar80 = vshufpd_avx(auVar63,auVar63,3);
      auVar74 = vsubps_avx(auVar74,auVar82);
      auVar82 = vsubps_avx(auVar77,auVar83);
      auVar83 = vsubps_avx(auVar81,auVar60);
      auVar80 = vsubps_avx(auVar80,auVar63);
      auVar77 = vminps_avx(auVar74,auVar82);
      auVar74 = vmaxps_avx(auVar74,auVar82);
      auVar81 = vminps_avx(auVar83,auVar80);
      auVar81 = vminps_avx(auVar77,auVar81);
      auVar77 = vmaxps_avx(auVar83,auVar80);
      auVar74 = vmaxps_avx(auVar74,auVar77);
      fVar243 = auVar61._0_4_;
      auVar250._0_4_ = fVar243 * auVar81._0_4_;
      auVar250._4_4_ = fVar243 * auVar81._4_4_;
      auVar250._8_4_ = fVar243 * auVar81._8_4_;
      auVar250._12_4_ = fVar243 * auVar81._12_4_;
      auVar233._0_4_ = fVar243 * auVar74._0_4_;
      auVar233._4_4_ = fVar243 * auVar74._4_4_;
      auVar233._8_4_ = fVar243 * auVar74._8_4_;
      auVar233._12_4_ = fVar243 * auVar74._12_4_;
      auVar80 = vinsertps_avx(auVar75,auVar79,0x10);
      auVar87 = vpermt2ps_avx512vl(auVar75,_DAT_01fb9f90,auVar86);
      auVar138._0_4_ = auVar80._0_4_ + auVar87._0_4_;
      auVar138._4_4_ = auVar80._4_4_ + auVar87._4_4_;
      auVar138._8_4_ = auVar80._8_4_ + auVar87._8_4_;
      auVar138._12_4_ = auVar80._12_4_ + auVar87._12_4_;
      auVar30._8_4_ = 0x3f000000;
      auVar30._0_8_ = 0x3f0000003f000000;
      auVar30._12_4_ = 0x3f000000;
      auVar63 = vmulps_avx512vl(auVar138,auVar30);
      auVar77 = vshufps_avx(auVar63,auVar63,0x54);
      uVar127 = auVar63._0_4_;
      auVar142._4_4_ = uVar127;
      auVar142._0_4_ = uVar127;
      auVar142._8_4_ = uVar127;
      auVar142._12_4_ = uVar127;
      auVar81 = vfmadd213ps_fma(local_470,auVar142,auVar84);
      auVar82 = vfmadd213ps_fma(local_480,auVar142,auVar76);
      auVar83 = vfmadd213ps_fma(local_490,auVar142,auVar85);
      auVar74 = vsubps_avx(auVar82,auVar81);
      auVar81 = vfmadd213ps_fma(auVar74,auVar142,auVar81);
      auVar74 = vsubps_avx(auVar83,auVar82);
      auVar74 = vfmadd213ps_fma(auVar74,auVar142,auVar82);
      auVar74 = vsubps_avx(auVar74,auVar81);
      auVar81 = vfmadd231ps_fma(auVar81,auVar74,auVar142);
      auVar60 = vmulps_avx512vl(auVar74,auVar69);
      auVar259._8_8_ = auVar81._0_8_;
      auVar259._0_8_ = auVar81._0_8_;
      auVar74 = vshufpd_avx(auVar81,auVar81,3);
      auVar81 = vshufps_avx(auVar63,auVar63,0x55);
      auVar82 = vsubps_avx(auVar74,auVar259);
      auVar83 = vfmadd231ps_fma(auVar259,auVar81,auVar82);
      auVar272._8_8_ = auVar60._0_8_;
      auVar272._0_8_ = auVar60._0_8_;
      auVar74 = vshufpd_avx(auVar60,auVar60,3);
      auVar74 = vsubps_avx512vl(auVar74,auVar272);
      auVar74 = vfmadd213ps_avx512vl(auVar74,auVar81,auVar272);
      auVar143._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
      auVar143._8_4_ = auVar82._8_4_ ^ 0x80000000;
      auVar143._12_4_ = auVar82._12_4_ ^ 0x80000000;
      auVar81 = vmovshdup_avx512vl(auVar74);
      auVar273._0_8_ = auVar81._0_8_ ^ 0x8000000080000000;
      auVar273._8_4_ = auVar81._8_4_ ^ 0x80000000;
      auVar273._12_4_ = auVar81._12_4_ ^ 0x80000000;
      auVar60 = vmovshdup_avx512vl(auVar82);
      auVar61 = vpermt2ps_avx512vl(auVar273,ZEXT416(5),auVar82);
      auVar81 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar81._0_4_ * auVar82._0_4_)),auVar74,auVar60);
      auVar82 = vpermt2ps_avx512vl(auVar74,SUB6416(ZEXT464(4),0),auVar143);
      auVar170._0_4_ = auVar81._0_4_;
      auVar170._4_4_ = auVar170._0_4_;
      auVar170._8_4_ = auVar170._0_4_;
      auVar170._12_4_ = auVar170._0_4_;
      auVar74 = vdivps_avx(auVar61,auVar170);
      auVar89 = vdivps_avx512vl(auVar82,auVar170);
      fVar243 = auVar83._0_4_;
      auVar81 = vshufps_avx(auVar83,auVar83,0x55);
      auVar260._0_4_ = fVar243 * auVar74._0_4_ + auVar81._0_4_ * auVar89._0_4_;
      auVar260._4_4_ = fVar243 * auVar74._4_4_ + auVar81._4_4_ * auVar89._4_4_;
      auVar260._8_4_ = fVar243 * auVar74._8_4_ + auVar81._8_4_ * auVar89._8_4_;
      auVar260._12_4_ = fVar243 * auVar74._12_4_ + auVar81._12_4_ * auVar89._12_4_;
      auVar64 = vsubps_avx(auVar77,auVar260);
      auVar81 = vmovshdup_avx(auVar74);
      auVar77 = vinsertps_avx(auVar218,auVar250,0x1c);
      auVar274._0_4_ = auVar81._0_4_ * auVar77._0_4_;
      auVar274._4_4_ = auVar81._4_4_ * auVar77._4_4_;
      auVar274._8_4_ = auVar81._8_4_ * auVar77._8_4_;
      auVar274._12_4_ = auVar81._12_4_ * auVar77._12_4_;
      auVar88 = vinsertps_avx512f(auVar205,auVar233,0x1c);
      auVar81 = vmulps_avx512vl(auVar81,auVar88);
      auVar61 = vminps_avx512vl(auVar274,auVar81);
      auVar83 = vmaxps_avx(auVar81,auVar274);
      auVar60 = vmovshdup_avx(auVar89);
      auVar81 = vinsertps_avx(auVar250,auVar218,0x4c);
      auVar251._0_4_ = auVar60._0_4_ * auVar81._0_4_;
      auVar251._4_4_ = auVar60._4_4_ * auVar81._4_4_;
      auVar251._8_4_ = auVar60._8_4_ * auVar81._8_4_;
      auVar251._12_4_ = auVar60._12_4_ * auVar81._12_4_;
      auVar82 = vinsertps_avx(auVar233,auVar205,0x4c);
      auVar234._0_4_ = auVar60._0_4_ * auVar82._0_4_;
      auVar234._4_4_ = auVar60._4_4_ * auVar82._4_4_;
      auVar234._8_4_ = auVar60._8_4_ * auVar82._8_4_;
      auVar234._12_4_ = auVar60._12_4_ * auVar82._12_4_;
      auVar60 = vminps_avx(auVar251,auVar234);
      auVar61 = vaddps_avx512vl(auVar61,auVar60);
      auVar60 = vmaxps_avx(auVar234,auVar251);
      auVar235._0_4_ = auVar83._0_4_ + auVar60._0_4_;
      auVar235._4_4_ = auVar83._4_4_ + auVar60._4_4_;
      auVar235._8_4_ = auVar83._8_4_ + auVar60._8_4_;
      auVar235._12_4_ = auVar83._12_4_ + auVar60._12_4_;
      auVar252._8_8_ = 0x3f80000000000000;
      auVar252._0_8_ = 0x3f80000000000000;
      auVar83 = vsubps_avx(auVar252,auVar235);
      auVar60 = vsubps_avx(auVar252,auVar61);
      auVar61 = vsubps_avx(auVar80,auVar63);
      auVar63 = vsubps_avx(auVar87,auVar63);
      fVar240 = auVar61._0_4_;
      auVar275._0_4_ = fVar240 * auVar83._0_4_;
      fVar241 = auVar61._4_4_;
      auVar275._4_4_ = fVar241 * auVar83._4_4_;
      fVar242 = auVar61._8_4_;
      auVar275._8_4_ = fVar242 * auVar83._8_4_;
      fVar262 = auVar61._12_4_;
      auVar275._12_4_ = fVar262 * auVar83._12_4_;
      auVar90 = vbroadcastss_avx512vl(auVar74);
      auVar77 = vmulps_avx512vl(auVar90,auVar77);
      auVar88 = vmulps_avx512vl(auVar90,auVar88);
      auVar90 = vminps_avx512vl(auVar77,auVar88);
      auVar88 = vmaxps_avx512vl(auVar88,auVar77);
      auVar77 = vbroadcastss_avx512vl(auVar89);
      auVar81 = vmulps_avx512vl(auVar77,auVar81);
      auVar77 = vmulps_avx512vl(auVar77,auVar82);
      auVar82 = vminps_avx512vl(auVar81,auVar77);
      auVar82 = vaddps_avx512vl(auVar90,auVar82);
      auVar61 = vmulps_avx512vl(auVar61,auVar60);
      fVar243 = auVar63._0_4_;
      auVar236._0_4_ = fVar243 * auVar83._0_4_;
      fVar229 = auVar63._4_4_;
      auVar236._4_4_ = fVar229 * auVar83._4_4_;
      fVar238 = auVar63._8_4_;
      auVar236._8_4_ = fVar238 * auVar83._8_4_;
      fVar239 = auVar63._12_4_;
      auVar236._12_4_ = fVar239 * auVar83._12_4_;
      auVar253._0_4_ = fVar243 * auVar60._0_4_;
      auVar253._4_4_ = fVar229 * auVar60._4_4_;
      auVar253._8_4_ = fVar238 * auVar60._8_4_;
      auVar253._12_4_ = fVar239 * auVar60._12_4_;
      auVar77 = vmaxps_avx(auVar77,auVar81);
      auVar206._0_4_ = auVar88._0_4_ + auVar77._0_4_;
      auVar206._4_4_ = auVar88._4_4_ + auVar77._4_4_;
      auVar206._8_4_ = auVar88._8_4_ + auVar77._8_4_;
      auVar206._12_4_ = auVar88._12_4_ + auVar77._12_4_;
      auVar219._8_8_ = 0x3f800000;
      auVar219._0_8_ = 0x3f800000;
      auVar77 = vsubps_avx(auVar219,auVar206);
      auVar81 = vsubps_avx512vl(auVar219,auVar82);
      auVar267._0_4_ = fVar240 * auVar77._0_4_;
      auVar267._4_4_ = fVar241 * auVar77._4_4_;
      auVar267._8_4_ = fVar242 * auVar77._8_4_;
      auVar267._12_4_ = fVar262 * auVar77._12_4_;
      auVar261._0_4_ = fVar240 * auVar81._0_4_;
      auVar261._4_4_ = fVar241 * auVar81._4_4_;
      auVar261._8_4_ = fVar242 * auVar81._8_4_;
      auVar261._12_4_ = fVar262 * auVar81._12_4_;
      auVar207._0_4_ = fVar243 * auVar77._0_4_;
      auVar207._4_4_ = fVar229 * auVar77._4_4_;
      auVar207._8_4_ = fVar238 * auVar77._8_4_;
      auVar207._12_4_ = fVar239 * auVar77._12_4_;
      auVar220._0_4_ = fVar243 * auVar81._0_4_;
      auVar220._4_4_ = fVar229 * auVar81._4_4_;
      auVar220._8_4_ = fVar238 * auVar81._8_4_;
      auVar220._12_4_ = fVar239 * auVar81._12_4_;
      auVar77 = vminps_avx(auVar267,auVar261);
      auVar81 = vminps_avx512vl(auVar207,auVar220);
      auVar82 = vminps_avx512vl(auVar77,auVar81);
      auVar77 = vmaxps_avx(auVar261,auVar267);
      auVar81 = vmaxps_avx(auVar220,auVar207);
      auVar81 = vmaxps_avx(auVar81,auVar77);
      auVar83 = vminps_avx512vl(auVar275,auVar61);
      auVar77 = vminps_avx(auVar236,auVar253);
      auVar77 = vminps_avx(auVar83,auVar77);
      auVar77 = vhaddps_avx(auVar82,auVar77);
      auVar124._0_16_ = vmaxps_avx512vl(auVar61,auVar275);
      auVar82 = vmaxps_avx(auVar253,auVar236);
      auVar82 = vmaxps_avx(auVar82,auVar124._0_16_);
      auVar81 = vhaddps_avx(auVar81,auVar82);
      auVar77 = vshufps_avx(auVar77,auVar77,0xe8);
      auVar81 = vshufps_avx(auVar81,auVar81,0xe8);
      auVar208._0_4_ = auVar77._0_4_ + auVar64._0_4_;
      auVar208._4_4_ = auVar77._4_4_ + auVar64._4_4_;
      auVar208._8_4_ = auVar77._8_4_ + auVar64._8_4_;
      auVar208._12_4_ = auVar77._12_4_ + auVar64._12_4_;
      auVar221._0_4_ = auVar81._0_4_ + auVar64._0_4_;
      auVar221._4_4_ = auVar81._4_4_ + auVar64._4_4_;
      auVar221._8_4_ = auVar81._8_4_ + auVar64._8_4_;
      auVar221._12_4_ = auVar81._12_4_ + auVar64._12_4_;
      auVar77 = vmaxps_avx(auVar80,auVar208);
      auVar81 = vminps_avx(auVar221,auVar87);
      uVar3 = vcmpps_avx512vl(auVar81,auVar77,1);
    } while ((uVar3 & 3) != 0);
    uVar3 = vcmpps_avx512vl(auVar221,auVar87,1);
    uVar26 = vcmpps_avx512vl(auVar75,auVar208,1);
    if (((ushort)uVar26 & (ushort)uVar3 & 1) == 0) {
      bVar47 = 0;
    }
    else {
      auVar77 = vmovshdup_avx(auVar208);
      bVar47 = auVar79._0_4_ < auVar77._0_4_ & (byte)(uVar3 >> 1) & 0x7f;
    }
    if (((3 < (uint)uVar49 || uVar8 != 0 && !bVar58) | bVar47) == 1) {
      lVar52 = 0xc9;
      do {
        lVar52 = lVar52 + -1;
        if (lVar52 == 0) goto LAB_018c5f34;
        auVar75 = vsubss_avx512f(auVar62,auVar64);
        fVar238 = auVar75._0_4_;
        fVar243 = fVar238 * fVar238 * fVar238;
        auVar75 = vmulss_avx512f(auVar64,ZEXT416(0x40400000));
        fVar229 = auVar75._0_4_ * fVar238 * fVar238;
        fVar239 = auVar64._0_4_;
        auVar75 = vmulss_avx512f(ZEXT416((uint)(fVar239 * fVar239)),ZEXT416(0x40400000));
        fVar238 = fVar238 * auVar75._0_4_;
        auVar157._4_4_ = fVar243;
        auVar157._0_4_ = fVar243;
        auVar157._8_4_ = fVar243;
        auVar157._12_4_ = fVar243;
        auVar149._4_4_ = fVar229;
        auVar149._0_4_ = fVar229;
        auVar149._8_4_ = fVar229;
        auVar149._12_4_ = fVar229;
        auVar131._4_4_ = fVar238;
        auVar131._0_4_ = fVar238;
        auVar131._8_4_ = fVar238;
        auVar131._12_4_ = fVar238;
        fVar239 = fVar239 * fVar239 * fVar239;
        auVar185._0_4_ = (float)local_4a0._0_4_ * fVar239;
        auVar185._4_4_ = (float)local_4a0._4_4_ * fVar239;
        auVar185._8_4_ = fStack_498 * fVar239;
        auVar185._12_4_ = fStack_494 * fVar239;
        auVar75 = vfmadd231ps_fma(auVar185,auVar85,auVar131);
        auVar75 = vfmadd231ps_fma(auVar75,auVar76,auVar149);
        auVar75 = vfmadd231ps_fma(auVar75,auVar84,auVar157);
        auVar132._8_8_ = auVar75._0_8_;
        auVar132._0_8_ = auVar75._0_8_;
        auVar75 = vshufpd_avx(auVar75,auVar75,3);
        auVar77 = vshufps_avx(auVar64,auVar64,0x55);
        auVar75 = vsubps_avx(auVar75,auVar132);
        auVar77 = vfmadd213ps_fma(auVar75,auVar77,auVar132);
        fVar243 = auVar77._0_4_;
        auVar75 = vshufps_avx(auVar77,auVar77,0x55);
        auVar133._0_4_ = auVar74._0_4_ * fVar243 + auVar89._0_4_ * auVar75._0_4_;
        auVar133._4_4_ = auVar74._4_4_ * fVar243 + auVar89._4_4_ * auVar75._4_4_;
        auVar133._8_4_ = auVar74._8_4_ * fVar243 + auVar89._8_4_ * auVar75._8_4_;
        auVar133._12_4_ = auVar74._12_4_ * fVar243 + auVar89._12_4_ * auVar75._12_4_;
        auVar64 = vsubps_avx(auVar64,auVar133);
        auVar75 = vandps_avx512vl(auVar77,auVar280._0_16_);
        auVar124._0_16_ = vprolq_avx512vl(auVar75,0x20);
        auVar75 = vmaxss_avx(auVar124._0_16_,auVar75);
        bVar58 = auVar75._0_4_ <= (float)local_4b0._0_4_;
      } while ((float)local_4b0._0_4_ <= auVar75._0_4_);
      auVar75 = vucomiss_avx512f(auVar68);
      if (bVar58) {
        auVar74 = vucomiss_avx512f(auVar75);
        auVar281 = ZEXT1664(auVar74);
        if (bVar58) {
          vmovshdup_avx(auVar75);
          auVar74 = vucomiss_avx512f(auVar68);
          if (bVar58) {
            auVar77 = vucomiss_avx512f(auVar74);
            auVar281 = ZEXT1664(auVar77);
            if (bVar58) {
              auVar81 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar63 = vinsertps_avx(auVar81,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                      0x28);
              auVar81 = vdpps_avx(auVar63,local_4c0,0x7f);
              auVar80 = vdpps_avx(auVar63,local_4d0,0x7f);
              auVar82 = vdpps_avx(auVar63,local_4e0,0x7f);
              auVar83 = vdpps_avx(auVar63,local_4f0,0x7f);
              auVar60 = vdpps_avx(auVar63,local_500,0x7f);
              auVar61 = vdpps_avx(auVar63,local_510,0x7f);
              auVar62 = vdpps_avx(auVar63,local_520,0x7f);
              auVar63 = vdpps_avx(auVar63,local_530,0x7f);
              auVar64 = vsubss_avx512f(auVar77,auVar74);
              fVar240 = auVar74._0_4_;
              auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar240 * auVar60._0_4_)),auVar64,auVar81);
              auVar81 = vfmadd231ss_fma(ZEXT416((uint)(auVar61._0_4_ * fVar240)),auVar64,auVar80);
              auVar80 = vfmadd231ss_fma(ZEXT416((uint)(auVar62._0_4_ * fVar240)),auVar64,auVar82);
              auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar240 * auVar63._0_4_)),auVar64,auVar83);
              auVar77 = vsubss_avx512f(auVar77,auVar75);
              auVar195._0_4_ = auVar77._0_4_;
              fVar229 = auVar195._0_4_ * auVar195._0_4_ * auVar195._0_4_;
              auVar77 = vmulss_avx512f(auVar75,ZEXT416(0x40400000));
              fVar238 = auVar77._0_4_ * auVar195._0_4_ * auVar195._0_4_;
              fVar243 = auVar75._0_4_;
              auVar186._0_4_ = fVar243 * fVar243;
              auVar186._4_4_ = auVar75._4_4_ * auVar75._4_4_;
              auVar186._8_4_ = auVar75._8_4_ * auVar75._8_4_;
              auVar186._12_4_ = auVar75._12_4_ * auVar75._12_4_;
              auVar124._0_16_ = vmulss_avx512f(auVar186,ZEXT416(0x40400000));
              fVar239 = auVar195._0_4_ * auVar124._0_4_;
              fVar242 = fVar243 * auVar186._0_4_;
              auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar242 * auVar82._0_4_)),
                                        ZEXT416((uint)fVar239),auVar80);
              auVar77 = vfmadd231ss_fma(auVar77,ZEXT416((uint)fVar238),auVar81);
              auVar74 = vfmadd231ss_fma(auVar77,ZEXT416((uint)fVar229),auVar74);
              fVar241 = auVar74._0_4_;
              if ((fVar174 <= fVar241) &&
                 (fVar262 = *(float *)(ray + k * 4 + 0x200), fVar241 <= fVar262)) {
                auVar74 = vshufps_avx(auVar75,auVar75,0x55);
                auVar222._8_4_ = 0x3f800000;
                auVar222._0_8_ = 0x3f8000003f800000;
                auVar222._12_4_ = 0x3f800000;
                auVar77 = vsubps_avx(auVar222,auVar74);
                fVar197 = auVar74._0_4_;
                auVar227._0_4_ = fVar197 * (float)local_580._0_4_;
                fVar212 = auVar74._4_4_;
                auVar227._4_4_ = fVar212 * (float)local_580._4_4_;
                fVar213 = auVar74._8_4_;
                auVar227._8_4_ = fVar213 * fStack_578;
                fVar214 = auVar74._12_4_;
                auVar227._12_4_ = fVar214 * fStack_574;
                auVar237._0_4_ = fVar197 * (float)local_590._0_4_;
                auVar237._4_4_ = fVar212 * (float)local_590._4_4_;
                auVar237._8_4_ = fVar213 * fStack_588;
                auVar237._12_4_ = fVar214 * fStack_584;
                auVar254._0_4_ = fVar197 * (float)local_5a0._0_4_;
                auVar254._4_4_ = fVar212 * (float)local_5a0._4_4_;
                auVar254._8_4_ = fVar213 * fStack_598;
                auVar254._12_4_ = fVar214 * fStack_594;
                auVar209._0_4_ = fVar197 * (float)local_5b0._0_4_;
                auVar209._4_4_ = fVar212 * (float)local_5b0._4_4_;
                auVar209._8_4_ = fVar213 * fStack_5a8;
                auVar209._12_4_ = fVar214 * fStack_5a4;
                auVar74 = vfmadd231ps_fma(auVar227,auVar77,local_540);
                auVar81 = vfmadd231ps_fma(auVar237,auVar77,local_550);
                auVar80 = vfmadd231ps_fma(auVar254,auVar77,local_560);
                auVar82 = vfmadd231ps_fma(auVar209,auVar77,local_570);
                auVar74 = vsubps_avx(auVar81,auVar74);
                auVar77 = vsubps_avx(auVar80,auVar81);
                auVar81 = vsubps_avx(auVar82,auVar80);
                auVar255._0_4_ = fVar243 * auVar77._0_4_;
                auVar255._4_4_ = fVar243 * auVar77._4_4_;
                auVar255._8_4_ = fVar243 * auVar77._8_4_;
                auVar255._12_4_ = fVar243 * auVar77._12_4_;
                auVar195._4_4_ = auVar195._0_4_;
                auVar195._8_4_ = auVar195._0_4_;
                auVar195._12_4_ = auVar195._0_4_;
                auVar74 = vfmadd231ps_fma(auVar255,auVar195,auVar74);
                auVar210._0_4_ = fVar243 * auVar81._0_4_;
                auVar210._4_4_ = fVar243 * auVar81._4_4_;
                auVar210._8_4_ = fVar243 * auVar81._8_4_;
                auVar210._12_4_ = fVar243 * auVar81._12_4_;
                auVar77 = vfmadd231ps_fma(auVar210,auVar195,auVar77);
                auVar211._0_4_ = fVar243 * auVar77._0_4_;
                auVar211._4_4_ = fVar243 * auVar77._4_4_;
                auVar211._8_4_ = fVar243 * auVar77._8_4_;
                auVar211._12_4_ = fVar243 * auVar77._12_4_;
                auVar74 = vfmadd231ps_fma(auVar211,auVar195,auVar74);
                auVar124._0_16_ = vmulps_avx512vl(auVar74,auVar69);
                pGVar9 = (context->scene->geometries).items[uVar6].ptr;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  auVar187._0_4_ = fVar242 * (float)local_5f0._0_4_;
                  auVar187._4_4_ = fVar242 * (float)local_5f0._4_4_;
                  auVar187._8_4_ = fVar242 * fStack_5e8;
                  auVar187._12_4_ = fVar242 * fStack_5e4;
                  auVar171._4_4_ = fVar239;
                  auVar171._0_4_ = fVar239;
                  auVar171._8_4_ = fVar239;
                  auVar171._12_4_ = fVar239;
                  auVar69 = vfmadd132ps_fma(auVar171,auVar187,local_5e0);
                  auVar158._4_4_ = fVar238;
                  auVar158._0_4_ = fVar238;
                  auVar158._8_4_ = fVar238;
                  auVar158._12_4_ = fVar238;
                  auVar69 = vfmadd132ps_fma(auVar158,auVar69,local_5d0);
                  auVar150._4_4_ = fVar229;
                  auVar150._0_4_ = fVar229;
                  auVar150._8_4_ = fVar229;
                  auVar150._12_4_ = fVar229;
                  auVar77 = vfmadd132ps_fma(auVar150,auVar69,local_5c0);
                  auVar69 = vshufps_avx(auVar77,auVar77,0xc9);
                  auVar74 = vshufps_avx(auVar124._0_16_,auVar124._0_16_,0xc9);
                  auVar151._0_4_ = auVar77._0_4_ * auVar74._0_4_;
                  auVar151._4_4_ = auVar77._4_4_ * auVar74._4_4_;
                  auVar151._8_4_ = auVar77._8_4_ * auVar74._8_4_;
                  auVar151._12_4_ = auVar77._12_4_ * auVar74._12_4_;
                  auVar69 = vfmsub231ps_fma(auVar151,auVar124._0_16_,auVar69);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x200) = fVar241;
                    uVar127 = vextractps_avx(auVar69,1);
                    *(undefined4 *)(ray + k * 4 + 0x300) = uVar127;
                    uVar127 = vextractps_avx(auVar69,2);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar127;
                    *(int *)(ray + k * 4 + 0x380) = auVar69._0_4_;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar243;
                    *(float *)(ray + k * 4 + 0x400) = fVar240;
                    *(uint *)(ray + k * 4 + 0x440) = uVar7;
                    *(uint *)(ray + k * 4 + 0x480) = uVar6;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                    goto LAB_018c5f34;
                  }
                  local_200 = vbroadcastss_avx512f(auVar75);
                  auVar123 = vbroadcastss_avx512f(ZEXT416(1));
                  local_1c0 = vpermps_avx512f(auVar123,ZEXT1664(auVar75));
                  auVar123 = vpermps_avx512f(auVar123,ZEXT1664(auVar69));
                  auVar124 = vbroadcastss_avx512f(ZEXT416(2));
                  local_280 = vpermps_avx512f(auVar124,ZEXT1664(auVar69));
                  local_240 = vbroadcastss_avx512f(auVar69);
                  local_2c0[0] = (RTCHitN)auVar123[0];
                  local_2c0[1] = (RTCHitN)auVar123[1];
                  local_2c0[2] = (RTCHitN)auVar123[2];
                  local_2c0[3] = (RTCHitN)auVar123[3];
                  local_2c0[4] = (RTCHitN)auVar123[4];
                  local_2c0[5] = (RTCHitN)auVar123[5];
                  local_2c0[6] = (RTCHitN)auVar123[6];
                  local_2c0[7] = (RTCHitN)auVar123[7];
                  local_2c0[8] = (RTCHitN)auVar123[8];
                  local_2c0[9] = (RTCHitN)auVar123[9];
                  local_2c0[10] = (RTCHitN)auVar123[10];
                  local_2c0[0xb] = (RTCHitN)auVar123[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar123[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar123[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar123[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar123[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar123[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar123[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar123[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar123[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar123[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar123[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar123[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar123[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar123[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar123[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar123[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar123[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar123[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar123[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar123[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar123[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar123[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar123[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar123[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar123[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar123[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar123[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar123[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar123[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar123[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar123[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar123[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar123[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar123[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar123[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar123[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar123[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar123[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar123[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar123[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar123[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar123[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar123[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar123[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar123[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar123[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar123[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar123[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar123[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar123[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar123[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar123[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar123[0x3f];
                  local_180 = local_340._0_8_;
                  uStack_178 = local_340._8_8_;
                  uStack_170 = local_340._16_8_;
                  uStack_168 = local_340._24_8_;
                  uStack_160 = local_340._32_8_;
                  uStack_158 = local_340._40_8_;
                  uStack_150 = local_340._48_8_;
                  uStack_148 = local_340._56_8_;
                  auVar123 = vmovdqa64_avx512f(local_300);
                  local_140 = vmovdqa64_avx512f(auVar123);
                  vpcmpeqd_avx2(auVar123._0_32_,auVar123._0_32_);
                  local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar241;
                  auVar124 = vmovdqa64_avx512f(local_380);
                  local_400 = vmovdqa64_avx512f(auVar124);
                  local_640.valid = (int *)local_400;
                  local_640.geometryUserPtr = pGVar9->userPtr;
                  local_640.context = context->user;
                  local_640.hit = local_2c0;
                  local_640.N = 0x10;
                  local_640.ray = (RTCRayN *)ray;
                  if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar9->intersectionFilterN)(&local_640);
                    auVar278 = ZEXT3264(_DAT_01fb9fe0);
                    auVar75 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                    auVar277 = ZEXT1664(auVar75);
                    auVar123._32_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar276 = ZEXT3264(auVar123._32_32_);
                    auVar75 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar282 = ZEXT1664(auVar75);
                    auVar281 = ZEXT464(0x3f800000);
                    auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar279 = ZEXT1664(auVar75);
                    auVar75 = vxorps_avx512vl(auVar68,auVar68);
                    auVar134 = ZEXT1664(auVar75);
                    auVar75 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar280 = ZEXT1664(auVar75);
                    auVar124 = vmovdqa64_avx512f(local_400);
                  }
                  auVar75 = auVar134._0_16_;
                  uVar26 = vptestmd_avx512f(auVar124,auVar124);
                  if ((short)uVar26 != 0) {
                    p_Var14 = context->args->filter;
                    if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var14)(&local_640);
                      auVar278 = ZEXT3264(_DAT_01fb9fe0);
                      auVar68 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar277 = ZEXT1664(auVar68);
                      auVar123._32_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar276 = ZEXT3264(auVar123._32_32_);
                      auVar68 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar282 = ZEXT1664(auVar68);
                      auVar281 = ZEXT464(0x3f800000);
                      auVar68 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar279 = ZEXT1664(auVar68);
                      auVar75 = vxorps_avx512vl(auVar75,auVar75);
                      auVar134 = ZEXT1664(auVar75);
                      auVar75 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar280 = ZEXT1664(auVar75);
                      auVar124 = vmovdqa64_avx512f(local_400);
                    }
                    uVar3 = vptestmd_avx512f(auVar124,auVar124);
                    if ((short)uVar3 != 0) {
                      iVar126 = *(int *)(local_640.hit + 4);
                      iVar33 = *(int *)(local_640.hit + 8);
                      iVar34 = *(int *)(local_640.hit + 0xc);
                      iVar35 = *(int *)(local_640.hit + 0x10);
                      iVar36 = *(int *)(local_640.hit + 0x14);
                      iVar37 = *(int *)(local_640.hit + 0x18);
                      iVar38 = *(int *)(local_640.hit + 0x1c);
                      iVar39 = *(int *)(local_640.hit + 0x20);
                      iVar40 = *(int *)(local_640.hit + 0x24);
                      iVar41 = *(int *)(local_640.hit + 0x28);
                      iVar42 = *(int *)(local_640.hit + 0x2c);
                      iVar43 = *(int *)(local_640.hit + 0x30);
                      iVar44 = *(int *)(local_640.hit + 0x34);
                      iVar45 = *(int *)(local_640.hit + 0x38);
                      iVar46 = *(int *)(local_640.hit + 0x3c);
                      bVar47 = (byte)uVar3;
                      bVar58 = (bool)((byte)(uVar3 >> 1) & 1);
                      bVar59 = (bool)((byte)(uVar3 >> 2) & 1);
                      bVar56 = (bool)((byte)(uVar3 >> 3) & 1);
                      bVar57 = (bool)((byte)(uVar3 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
                      bVar17 = (bool)((byte)(uVar3 >> 7) & 1);
                      bVar18 = (byte)(uVar3 >> 8);
                      bVar19 = (bool)((byte)(uVar3 >> 9) & 1);
                      bVar20 = (bool)((byte)(uVar3 >> 10) & 1);
                      bVar21 = (bool)((byte)(uVar3 >> 0xb) & 1);
                      bVar22 = (bool)((byte)(uVar3 >> 0xc) & 1);
                      bVar23 = (bool)((byte)(uVar3 >> 0xd) & 1);
                      bVar24 = (bool)((byte)(uVar3 >> 0xe) & 1);
                      bVar25 = SUB81(uVar3 >> 0xf,0);
                      *(uint *)(local_640.ray + 0x300) =
                           (uint)(bVar47 & 1) * *(int *)local_640.hit |
                           (uint)!(bool)(bVar47 & 1) * *(int *)(local_640.ray + 0x300);
                      *(uint *)(local_640.ray + 0x304) =
                           (uint)bVar58 * iVar126 | (uint)!bVar58 * *(int *)(local_640.ray + 0x304);
                      *(uint *)(local_640.ray + 0x308) =
                           (uint)bVar59 * iVar33 | (uint)!bVar59 * *(int *)(local_640.ray + 0x308);
                      *(uint *)(local_640.ray + 0x30c) =
                           (uint)bVar56 * iVar34 | (uint)!bVar56 * *(int *)(local_640.ray + 0x30c);
                      *(uint *)(local_640.ray + 0x310) =
                           (uint)bVar57 * iVar35 | (uint)!bVar57 * *(int *)(local_640.ray + 0x310);
                      *(uint *)(local_640.ray + 0x314) =
                           (uint)bVar15 * iVar36 | (uint)!bVar15 * *(int *)(local_640.ray + 0x314);
                      *(uint *)(local_640.ray + 0x318) =
                           (uint)bVar16 * iVar37 | (uint)!bVar16 * *(int *)(local_640.ray + 0x318);
                      *(uint *)(local_640.ray + 0x31c) =
                           (uint)bVar17 * iVar38 | (uint)!bVar17 * *(int *)(local_640.ray + 0x31c);
                      *(uint *)(local_640.ray + 800) =
                           (uint)(bVar18 & 1) * iVar39 |
                           (uint)!(bool)(bVar18 & 1) * *(int *)(local_640.ray + 800);
                      *(uint *)(local_640.ray + 0x324) =
                           (uint)bVar19 * iVar40 | (uint)!bVar19 * *(int *)(local_640.ray + 0x324);
                      *(uint *)(local_640.ray + 0x328) =
                           (uint)bVar20 * iVar41 | (uint)!bVar20 * *(int *)(local_640.ray + 0x328);
                      *(uint *)(local_640.ray + 0x32c) =
                           (uint)bVar21 * iVar42 | (uint)!bVar21 * *(int *)(local_640.ray + 0x32c);
                      *(uint *)(local_640.ray + 0x330) =
                           (uint)bVar22 * iVar43 | (uint)!bVar22 * *(int *)(local_640.ray + 0x330);
                      *(uint *)(local_640.ray + 0x334) =
                           (uint)bVar23 * iVar44 | (uint)!bVar23 * *(int *)(local_640.ray + 0x334);
                      *(uint *)(local_640.ray + 0x338) =
                           (uint)bVar24 * iVar45 | (uint)!bVar24 * *(int *)(local_640.ray + 0x338);
                      *(uint *)(local_640.ray + 0x33c) =
                           (uint)bVar25 * iVar46 | (uint)!bVar25 * *(int *)(local_640.ray + 0x33c);
                      iVar126 = *(int *)(local_640.hit + 0x44);
                      iVar33 = *(int *)(local_640.hit + 0x48);
                      iVar34 = *(int *)(local_640.hit + 0x4c);
                      iVar35 = *(int *)(local_640.hit + 0x50);
                      iVar36 = *(int *)(local_640.hit + 0x54);
                      iVar37 = *(int *)(local_640.hit + 0x58);
                      iVar38 = *(int *)(local_640.hit + 0x5c);
                      iVar39 = *(int *)(local_640.hit + 0x60);
                      iVar40 = *(int *)(local_640.hit + 100);
                      iVar41 = *(int *)(local_640.hit + 0x68);
                      iVar42 = *(int *)(local_640.hit + 0x6c);
                      iVar43 = *(int *)(local_640.hit + 0x70);
                      iVar44 = *(int *)(local_640.hit + 0x74);
                      iVar45 = *(int *)(local_640.hit + 0x78);
                      iVar46 = *(int *)(local_640.hit + 0x7c);
                      bVar58 = (bool)((byte)(uVar3 >> 1) & 1);
                      bVar59 = (bool)((byte)(uVar3 >> 2) & 1);
                      bVar56 = (bool)((byte)(uVar3 >> 3) & 1);
                      bVar57 = (bool)((byte)(uVar3 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
                      bVar17 = (bool)((byte)(uVar3 >> 7) & 1);
                      bVar19 = (bool)((byte)(uVar3 >> 9) & 1);
                      bVar20 = (bool)((byte)(uVar3 >> 10) & 1);
                      bVar21 = (bool)((byte)(uVar3 >> 0xb) & 1);
                      bVar22 = (bool)((byte)(uVar3 >> 0xc) & 1);
                      bVar23 = (bool)((byte)(uVar3 >> 0xd) & 1);
                      bVar24 = (bool)((byte)(uVar3 >> 0xe) & 1);
                      bVar25 = SUB81(uVar3 >> 0xf,0);
                      *(uint *)(local_640.ray + 0x340) =
                           (uint)(bVar47 & 1) * *(int *)(local_640.hit + 0x40) |
                           (uint)!(bool)(bVar47 & 1) * *(int *)(local_640.ray + 0x340);
                      *(uint *)(local_640.ray + 0x344) =
                           (uint)bVar58 * iVar126 | (uint)!bVar58 * *(int *)(local_640.ray + 0x344);
                      *(uint *)(local_640.ray + 0x348) =
                           (uint)bVar59 * iVar33 | (uint)!bVar59 * *(int *)(local_640.ray + 0x348);
                      *(uint *)(local_640.ray + 0x34c) =
                           (uint)bVar56 * iVar34 | (uint)!bVar56 * *(int *)(local_640.ray + 0x34c);
                      *(uint *)(local_640.ray + 0x350) =
                           (uint)bVar57 * iVar35 | (uint)!bVar57 * *(int *)(local_640.ray + 0x350);
                      *(uint *)(local_640.ray + 0x354) =
                           (uint)bVar15 * iVar36 | (uint)!bVar15 * *(int *)(local_640.ray + 0x354);
                      *(uint *)(local_640.ray + 0x358) =
                           (uint)bVar16 * iVar37 | (uint)!bVar16 * *(int *)(local_640.ray + 0x358);
                      *(uint *)(local_640.ray + 0x35c) =
                           (uint)bVar17 * iVar38 | (uint)!bVar17 * *(int *)(local_640.ray + 0x35c);
                      *(uint *)(local_640.ray + 0x360) =
                           (uint)(bVar18 & 1) * iVar39 |
                           (uint)!(bool)(bVar18 & 1) * *(int *)(local_640.ray + 0x360);
                      *(uint *)(local_640.ray + 0x364) =
                           (uint)bVar19 * iVar40 | (uint)!bVar19 * *(int *)(local_640.ray + 0x364);
                      *(uint *)(local_640.ray + 0x368) =
                           (uint)bVar20 * iVar41 | (uint)!bVar20 * *(int *)(local_640.ray + 0x368);
                      *(uint *)(local_640.ray + 0x36c) =
                           (uint)bVar21 * iVar42 | (uint)!bVar21 * *(int *)(local_640.ray + 0x36c);
                      *(uint *)(local_640.ray + 0x370) =
                           (uint)bVar22 * iVar43 | (uint)!bVar22 * *(int *)(local_640.ray + 0x370);
                      *(uint *)(local_640.ray + 0x374) =
                           (uint)bVar23 * iVar44 | (uint)!bVar23 * *(int *)(local_640.ray + 0x374);
                      *(uint *)(local_640.ray + 0x378) =
                           (uint)bVar24 * iVar45 | (uint)!bVar24 * *(int *)(local_640.ray + 0x378);
                      *(uint *)(local_640.ray + 0x37c) =
                           (uint)bVar25 * iVar46 | (uint)!bVar25 * *(int *)(local_640.ray + 0x37c);
                      iVar126 = *(int *)(local_640.hit + 0x84);
                      iVar33 = *(int *)(local_640.hit + 0x88);
                      iVar34 = *(int *)(local_640.hit + 0x8c);
                      iVar35 = *(int *)(local_640.hit + 0x90);
                      iVar36 = *(int *)(local_640.hit + 0x94);
                      iVar37 = *(int *)(local_640.hit + 0x98);
                      iVar38 = *(int *)(local_640.hit + 0x9c);
                      iVar39 = *(int *)(local_640.hit + 0xa0);
                      iVar40 = *(int *)(local_640.hit + 0xa4);
                      iVar41 = *(int *)(local_640.hit + 0xa8);
                      iVar42 = *(int *)(local_640.hit + 0xac);
                      iVar43 = *(int *)(local_640.hit + 0xb0);
                      iVar44 = *(int *)(local_640.hit + 0xb4);
                      iVar45 = *(int *)(local_640.hit + 0xb8);
                      iVar46 = *(int *)(local_640.hit + 0xbc);
                      bVar58 = (bool)((byte)(uVar3 >> 1) & 1);
                      bVar59 = (bool)((byte)(uVar3 >> 2) & 1);
                      bVar56 = (bool)((byte)(uVar3 >> 3) & 1);
                      bVar57 = (bool)((byte)(uVar3 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
                      bVar17 = (bool)((byte)(uVar3 >> 7) & 1);
                      bVar19 = (bool)((byte)(uVar3 >> 9) & 1);
                      bVar20 = (bool)((byte)(uVar3 >> 10) & 1);
                      bVar21 = (bool)((byte)(uVar3 >> 0xb) & 1);
                      bVar22 = (bool)((byte)(uVar3 >> 0xc) & 1);
                      bVar23 = (bool)((byte)(uVar3 >> 0xd) & 1);
                      bVar24 = (bool)((byte)(uVar3 >> 0xe) & 1);
                      bVar25 = SUB81(uVar3 >> 0xf,0);
                      *(uint *)(local_640.ray + 0x380) =
                           (uint)(bVar47 & 1) * *(int *)(local_640.hit + 0x80) |
                           (uint)!(bool)(bVar47 & 1) * *(int *)(local_640.ray + 0x380);
                      *(uint *)(local_640.ray + 900) =
                           (uint)bVar58 * iVar126 | (uint)!bVar58 * *(int *)(local_640.ray + 900);
                      *(uint *)(local_640.ray + 0x388) =
                           (uint)bVar59 * iVar33 | (uint)!bVar59 * *(int *)(local_640.ray + 0x388);
                      *(uint *)(local_640.ray + 0x38c) =
                           (uint)bVar56 * iVar34 | (uint)!bVar56 * *(int *)(local_640.ray + 0x38c);
                      *(uint *)(local_640.ray + 0x390) =
                           (uint)bVar57 * iVar35 | (uint)!bVar57 * *(int *)(local_640.ray + 0x390);
                      *(uint *)(local_640.ray + 0x394) =
                           (uint)bVar15 * iVar36 | (uint)!bVar15 * *(int *)(local_640.ray + 0x394);
                      *(uint *)(local_640.ray + 0x398) =
                           (uint)bVar16 * iVar37 | (uint)!bVar16 * *(int *)(local_640.ray + 0x398);
                      *(uint *)(local_640.ray + 0x39c) =
                           (uint)bVar17 * iVar38 | (uint)!bVar17 * *(int *)(local_640.ray + 0x39c);
                      *(uint *)(local_640.ray + 0x3a0) =
                           (uint)(bVar18 & 1) * iVar39 |
                           (uint)!(bool)(bVar18 & 1) * *(int *)(local_640.ray + 0x3a0);
                      *(uint *)(local_640.ray + 0x3a4) =
                           (uint)bVar19 * iVar40 | (uint)!bVar19 * *(int *)(local_640.ray + 0x3a4);
                      *(uint *)(local_640.ray + 0x3a8) =
                           (uint)bVar20 * iVar41 | (uint)!bVar20 * *(int *)(local_640.ray + 0x3a8);
                      *(uint *)(local_640.ray + 0x3ac) =
                           (uint)bVar21 * iVar42 | (uint)!bVar21 * *(int *)(local_640.ray + 0x3ac);
                      *(uint *)(local_640.ray + 0x3b0) =
                           (uint)bVar22 * iVar43 | (uint)!bVar22 * *(int *)(local_640.ray + 0x3b0);
                      *(uint *)(local_640.ray + 0x3b4) =
                           (uint)bVar23 * iVar44 | (uint)!bVar23 * *(int *)(local_640.ray + 0x3b4);
                      *(uint *)(local_640.ray + 0x3b8) =
                           (uint)bVar24 * iVar45 | (uint)!bVar24 * *(int *)(local_640.ray + 0x3b8);
                      *(uint *)(local_640.ray + 0x3bc) =
                           (uint)bVar25 * iVar46 | (uint)!bVar25 * *(int *)(local_640.ray + 0x3bc);
                      iVar126 = *(int *)(local_640.hit + 0xc4);
                      iVar33 = *(int *)(local_640.hit + 200);
                      iVar34 = *(int *)(local_640.hit + 0xcc);
                      iVar35 = *(int *)(local_640.hit + 0xd0);
                      iVar36 = *(int *)(local_640.hit + 0xd4);
                      iVar37 = *(int *)(local_640.hit + 0xd8);
                      iVar38 = *(int *)(local_640.hit + 0xdc);
                      iVar39 = *(int *)(local_640.hit + 0xe0);
                      iVar40 = *(int *)(local_640.hit + 0xe4);
                      iVar41 = *(int *)(local_640.hit + 0xe8);
                      iVar42 = *(int *)(local_640.hit + 0xec);
                      iVar43 = *(int *)(local_640.hit + 0xf0);
                      iVar44 = *(int *)(local_640.hit + 0xf4);
                      iVar45 = *(int *)(local_640.hit + 0xf8);
                      iVar46 = *(int *)(local_640.hit + 0xfc);
                      bVar58 = (bool)((byte)(uVar3 >> 1) & 1);
                      bVar59 = (bool)((byte)(uVar3 >> 2) & 1);
                      bVar56 = (bool)((byte)(uVar3 >> 3) & 1);
                      bVar57 = (bool)((byte)(uVar3 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
                      bVar17 = (bool)((byte)(uVar3 >> 7) & 1);
                      bVar19 = (bool)((byte)(uVar3 >> 9) & 1);
                      bVar20 = (bool)((byte)(uVar3 >> 10) & 1);
                      bVar21 = (bool)((byte)(uVar3 >> 0xb) & 1);
                      bVar22 = (bool)((byte)(uVar3 >> 0xc) & 1);
                      bVar23 = (bool)((byte)(uVar3 >> 0xd) & 1);
                      bVar24 = (bool)((byte)(uVar3 >> 0xe) & 1);
                      bVar25 = SUB81(uVar3 >> 0xf,0);
                      *(uint *)(local_640.ray + 0x3c0) =
                           (uint)(bVar47 & 1) * *(int *)(local_640.hit + 0xc0) |
                           (uint)!(bool)(bVar47 & 1) * *(int *)(local_640.ray + 0x3c0);
                      *(uint *)(local_640.ray + 0x3c4) =
                           (uint)bVar58 * iVar126 | (uint)!bVar58 * *(int *)(local_640.ray + 0x3c4);
                      *(uint *)(local_640.ray + 0x3c8) =
                           (uint)bVar59 * iVar33 | (uint)!bVar59 * *(int *)(local_640.ray + 0x3c8);
                      *(uint *)(local_640.ray + 0x3cc) =
                           (uint)bVar56 * iVar34 | (uint)!bVar56 * *(int *)(local_640.ray + 0x3cc);
                      *(uint *)(local_640.ray + 0x3d0) =
                           (uint)bVar57 * iVar35 | (uint)!bVar57 * *(int *)(local_640.ray + 0x3d0);
                      *(uint *)(local_640.ray + 0x3d4) =
                           (uint)bVar15 * iVar36 | (uint)!bVar15 * *(int *)(local_640.ray + 0x3d4);
                      *(uint *)(local_640.ray + 0x3d8) =
                           (uint)bVar16 * iVar37 | (uint)!bVar16 * *(int *)(local_640.ray + 0x3d8);
                      *(uint *)(local_640.ray + 0x3dc) =
                           (uint)bVar17 * iVar38 | (uint)!bVar17 * *(int *)(local_640.ray + 0x3dc);
                      *(uint *)(local_640.ray + 0x3e0) =
                           (uint)(bVar18 & 1) * iVar39 |
                           (uint)!(bool)(bVar18 & 1) * *(int *)(local_640.ray + 0x3e0);
                      *(uint *)(local_640.ray + 0x3e4) =
                           (uint)bVar19 * iVar40 | (uint)!bVar19 * *(int *)(local_640.ray + 0x3e4);
                      *(uint *)(local_640.ray + 1000) =
                           (uint)bVar20 * iVar41 | (uint)!bVar20 * *(int *)(local_640.ray + 1000);
                      *(uint *)(local_640.ray + 0x3ec) =
                           (uint)bVar21 * iVar42 | (uint)!bVar21 * *(int *)(local_640.ray + 0x3ec);
                      *(uint *)(local_640.ray + 0x3f0) =
                           (uint)bVar22 * iVar43 | (uint)!bVar22 * *(int *)(local_640.ray + 0x3f0);
                      *(uint *)(local_640.ray + 0x3f4) =
                           (uint)bVar23 * iVar44 | (uint)!bVar23 * *(int *)(local_640.ray + 0x3f4);
                      *(uint *)(local_640.ray + 0x3f8) =
                           (uint)bVar24 * iVar45 | (uint)!bVar24 * *(int *)(local_640.ray + 0x3f8);
                      *(uint *)(local_640.ray + 0x3fc) =
                           (uint)bVar25 * iVar46 | (uint)!bVar25 * *(int *)(local_640.ray + 0x3fc);
                      iVar126 = *(int *)(local_640.hit + 0x104);
                      iVar33 = *(int *)(local_640.hit + 0x108);
                      iVar34 = *(int *)(local_640.hit + 0x10c);
                      iVar35 = *(int *)(local_640.hit + 0x110);
                      iVar36 = *(int *)(local_640.hit + 0x114);
                      iVar37 = *(int *)(local_640.hit + 0x118);
                      iVar38 = *(int *)(local_640.hit + 0x11c);
                      iVar39 = *(int *)(local_640.hit + 0x120);
                      iVar40 = *(int *)(local_640.hit + 0x124);
                      iVar41 = *(int *)(local_640.hit + 0x128);
                      iVar42 = *(int *)(local_640.hit + 300);
                      iVar43 = *(int *)(local_640.hit + 0x130);
                      iVar44 = *(int *)(local_640.hit + 0x134);
                      iVar45 = *(int *)(local_640.hit + 0x138);
                      iVar46 = *(int *)(local_640.hit + 0x13c);
                      bVar58 = (bool)((byte)(uVar3 >> 1) & 1);
                      bVar59 = (bool)((byte)(uVar3 >> 2) & 1);
                      bVar56 = (bool)((byte)(uVar3 >> 3) & 1);
                      bVar57 = (bool)((byte)(uVar3 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
                      bVar17 = (bool)((byte)(uVar3 >> 7) & 1);
                      bVar19 = (bool)((byte)(uVar3 >> 9) & 1);
                      bVar20 = (bool)((byte)(uVar3 >> 10) & 1);
                      bVar21 = (bool)((byte)(uVar3 >> 0xb) & 1);
                      bVar22 = (bool)((byte)(uVar3 >> 0xc) & 1);
                      bVar23 = (bool)((byte)(uVar3 >> 0xd) & 1);
                      bVar24 = (bool)((byte)(uVar3 >> 0xe) & 1);
                      bVar25 = SUB81(uVar3 >> 0xf,0);
                      *(uint *)(local_640.ray + 0x400) =
                           (uint)(bVar47 & 1) * *(int *)(local_640.hit + 0x100) |
                           (uint)!(bool)(bVar47 & 1) * *(int *)(local_640.ray + 0x400);
                      *(uint *)(local_640.ray + 0x404) =
                           (uint)bVar58 * iVar126 | (uint)!bVar58 * *(int *)(local_640.ray + 0x404);
                      *(uint *)(local_640.ray + 0x408) =
                           (uint)bVar59 * iVar33 | (uint)!bVar59 * *(int *)(local_640.ray + 0x408);
                      *(uint *)(local_640.ray + 0x40c) =
                           (uint)bVar56 * iVar34 | (uint)!bVar56 * *(int *)(local_640.ray + 0x40c);
                      *(uint *)(local_640.ray + 0x410) =
                           (uint)bVar57 * iVar35 | (uint)!bVar57 * *(int *)(local_640.ray + 0x410);
                      *(uint *)(local_640.ray + 0x414) =
                           (uint)bVar15 * iVar36 | (uint)!bVar15 * *(int *)(local_640.ray + 0x414);
                      *(uint *)(local_640.ray + 0x418) =
                           (uint)bVar16 * iVar37 | (uint)!bVar16 * *(int *)(local_640.ray + 0x418);
                      *(uint *)(local_640.ray + 0x41c) =
                           (uint)bVar17 * iVar38 | (uint)!bVar17 * *(int *)(local_640.ray + 0x41c);
                      *(uint *)(local_640.ray + 0x420) =
                           (uint)(bVar18 & 1) * iVar39 |
                           (uint)!(bool)(bVar18 & 1) * *(int *)(local_640.ray + 0x420);
                      *(uint *)(local_640.ray + 0x424) =
                           (uint)bVar19 * iVar40 | (uint)!bVar19 * *(int *)(local_640.ray + 0x424);
                      *(uint *)(local_640.ray + 0x428) =
                           (uint)bVar20 * iVar41 | (uint)!bVar20 * *(int *)(local_640.ray + 0x428);
                      *(uint *)(local_640.ray + 0x42c) =
                           (uint)bVar21 * iVar42 | (uint)!bVar21 * *(int *)(local_640.ray + 0x42c);
                      *(uint *)(local_640.ray + 0x430) =
                           (uint)bVar22 * iVar43 | (uint)!bVar22 * *(int *)(local_640.ray + 0x430);
                      *(uint *)(local_640.ray + 0x434) =
                           (uint)bVar23 * iVar44 | (uint)!bVar23 * *(int *)(local_640.ray + 0x434);
                      *(uint *)(local_640.ray + 0x438) =
                           (uint)bVar24 * iVar45 | (uint)!bVar24 * *(int *)(local_640.ray + 0x438);
                      *(uint *)(local_640.ray + 0x43c) =
                           (uint)bVar25 * iVar46 | (uint)!bVar25 * *(int *)(local_640.ray + 0x43c);
                      auVar123 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_640.hit + 0x140));
                      auVar123 = vmovdqu32_avx512f(auVar123);
                      *(undefined1 (*) [64])(local_640.ray + 0x440) = auVar123;
                      auVar123 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_640.hit + 0x180));
                      auVar123 = vmovdqu32_avx512f(auVar123);
                      *(undefined1 (*) [64])(local_640.ray + 0x480) = auVar123;
                      auVar125 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_640.hit + 0x1c0));
                      auVar123 = vmovdqa32_avx512f(auVar125);
                      *(undefined1 (*) [64])(local_640.ray + 0x4c0) = auVar123;
                      auVar123 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_640.hit + 0x200));
                      bVar58 = (bool)((byte)(uVar3 >> 1) & 1);
                      auVar32._4_56_ = auVar123._8_56_;
                      auVar32._0_4_ = (uint)bVar58 * auVar123._4_4_ | (uint)!bVar58 * auVar125._4_4_
                      ;
                      auVar124._0_8_ = auVar32._0_8_ << 0x20;
                      bVar58 = (bool)((byte)(uVar3 >> 2) & 1);
                      auVar124._8_4_ =
                           (uint)bVar58 * auVar123._8_4_ | (uint)!bVar58 * auVar125._8_4_;
                      bVar58 = (bool)((byte)(uVar3 >> 3) & 1);
                      auVar124._12_4_ =
                           (uint)bVar58 * auVar123._12_4_ | (uint)!bVar58 * auVar125._12_4_;
                      bVar58 = (bool)((byte)(uVar3 >> 4) & 1);
                      auVar124._16_4_ =
                           (uint)bVar58 * auVar123._16_4_ | (uint)!bVar58 * auVar125._16_4_;
                      bVar58 = (bool)((byte)(uVar3 >> 5) & 1);
                      auVar124._20_4_ =
                           (uint)bVar58 * auVar123._20_4_ | (uint)!bVar58 * auVar125._20_4_;
                      bVar58 = (bool)((byte)(uVar3 >> 6) & 1);
                      auVar124._24_4_ =
                           (uint)bVar58 * auVar123._24_4_ | (uint)!bVar58 * auVar125._24_4_;
                      bVar58 = (bool)((byte)(uVar3 >> 7) & 1);
                      auVar124._28_4_ =
                           (uint)bVar58 * auVar123._28_4_ | (uint)!bVar58 * auVar125._28_4_;
                      auVar124._32_4_ =
                           (uint)(bVar18 & 1) * auVar123._32_4_ |
                           (uint)!(bool)(bVar18 & 1) * auVar125._32_4_;
                      bVar58 = (bool)((byte)(uVar3 >> 9) & 1);
                      auVar124._36_4_ =
                           (uint)bVar58 * auVar123._36_4_ | (uint)!bVar58 * auVar125._36_4_;
                      bVar58 = (bool)((byte)(uVar3 >> 10) & 1);
                      auVar124._40_4_ =
                           (uint)bVar58 * auVar123._40_4_ | (uint)!bVar58 * auVar125._40_4_;
                      bVar58 = (bool)((byte)(uVar3 >> 0xb) & 1);
                      auVar124._44_4_ =
                           (uint)bVar58 * auVar123._44_4_ | (uint)!bVar58 * auVar125._44_4_;
                      bVar58 = (bool)((byte)(uVar3 >> 0xc) & 1);
                      auVar124._48_4_ =
                           (uint)bVar58 * auVar123._48_4_ | (uint)!bVar58 * auVar125._48_4_;
                      bVar58 = (bool)((byte)(uVar3 >> 0xd) & 1);
                      auVar124._52_4_ =
                           (uint)bVar58 * auVar123._52_4_ | (uint)!bVar58 * auVar125._52_4_;
                      bVar58 = (bool)((byte)(uVar3 >> 0xe) & 1);
                      auVar124._56_4_ =
                           (uint)bVar58 * auVar123._56_4_ | (uint)!bVar58 * auVar125._56_4_;
                      bVar58 = SUB81(uVar3 >> 0xf,0);
                      auVar124._60_4_ =
                           (uint)bVar58 * auVar123._60_4_ | (uint)!bVar58 * auVar125._60_4_;
                      auVar123 = vmovdqa32_avx512f(auVar123);
                      *(undefined1 (*) [64])(local_640.ray + 0x500) = auVar123;
                      goto LAB_018c5f34;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar262;
                }
              }
            }
          }
        }
      }
      goto LAB_018c5f34;
    }
    auVar61 = vinsertps_avx(auVar79,auVar86,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }